

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [12];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  byte bVar61;
  byte bVar62;
  ulong uVar63;
  byte bVar64;
  byte bVar65;
  byte bVar66;
  long lVar67;
  long lVar68;
  undefined1 uVar69;
  bool bVar70;
  undefined1 uVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar130;
  uint uVar131;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uint uVar133;
  uint uVar134;
  uint uVar135;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  uint uVar132;
  uint uVar136;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar137;
  float fVar157;
  float fVar159;
  vint4 bi_2;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar164;
  vint4 bi_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar186;
  float fVar187;
  float fVar205;
  float fVar206;
  vint4 bi;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar207;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  float fVar230;
  float fVar231;
  vint4 ai_2;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  vint4 ai_1;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar237;
  undefined1 auVar236 [64];
  vint4 ai;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar243 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [64];
  float fVar254;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar255 [64];
  float fVar260;
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [16];
  float fVar265;
  undefined1 auVar264 [32];
  undefined1 auVar266 [64];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  undefined1 auVar284 [64];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  undefined1 auVar287 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_9f1;
  float local_980;
  float fStack_97c;
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined8 local_950;
  undefined8 uStack_948;
  uint local_934;
  uint local_930;
  undefined4 local_92c;
  float local_928;
  float local_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  ulong local_728;
  ulong local_720;
  ulong local_718;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  Primitive *local_510;
  ulong local_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  RTCHitN local_480 [16];
  undefined1 auStack_470 [16];
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [16];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined1 local_420 [16];
  uint local_410;
  uint uStack_40c;
  uint uStack_408;
  uint uStack_404;
  uint uStack_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar126 [32];
  undefined1 auVar269 [64];
  
  PVar3 = prim[1];
  uVar63 = (ulong)(byte)PVar3;
  lVar68 = uVar63 * 0x25;
  fVar254 = *(float *)(prim + lVar68 + 0x12);
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar78 = vsubps_avx(auVar78,*(undefined1 (*) [16])(prim + lVar68 + 6));
  auVar208._0_4_ = fVar254 * auVar78._0_4_;
  auVar208._4_4_ = fVar254 * auVar78._4_4_;
  auVar208._8_4_ = fVar254 * auVar78._8_4_;
  auVar208._12_4_ = fVar254 * auVar78._12_4_;
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar138._0_4_ = fVar254 * auVar77._0_4_;
  auVar138._4_4_ = fVar254 * auVar77._4_4_;
  auVar138._8_4_ = fVar254 * auVar77._8_4_;
  auVar138._12_4_ = fVar254 * auVar77._12_4_;
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xf + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar3 * 0x10 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar63 + 6)));
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1a + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1b + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1c + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar232._4_4_ = auVar138._0_4_;
  auVar232._0_4_ = auVar138._0_4_;
  auVar232._8_4_ = auVar138._0_4_;
  auVar232._12_4_ = auVar138._0_4_;
  auVar83 = vshufps_avx(auVar138,auVar138,0x55);
  auVar17 = vshufps_avx(auVar138,auVar138,0xaa);
  fVar254 = auVar17._0_4_;
  auVar188._0_4_ = fVar254 * auVar16._0_4_;
  fVar157 = auVar17._4_4_;
  auVar188._4_4_ = fVar157 * auVar16._4_4_;
  fVar256 = auVar17._8_4_;
  auVar188._8_4_ = fVar256 * auVar16._8_4_;
  fVar257 = auVar17._12_4_;
  auVar188._12_4_ = fVar257 * auVar16._12_4_;
  auVar165._0_4_ = auVar223._0_4_ * fVar254;
  auVar165._4_4_ = auVar223._4_4_ * fVar157;
  auVar165._8_4_ = auVar223._8_4_ * fVar256;
  auVar165._12_4_ = auVar223._12_4_ * fVar257;
  auVar139._0_4_ = auVar82._0_4_ * fVar254;
  auVar139._4_4_ = auVar82._4_4_ * fVar157;
  auVar139._8_4_ = auVar82._8_4_ * fVar256;
  auVar139._12_4_ = auVar82._12_4_ * fVar257;
  auVar17 = vfmadd231ps_fma(auVar188,auVar83,auVar77);
  auVar23 = vfmadd231ps_fma(auVar165,auVar83,auVar81);
  auVar83 = vfmadd231ps_fma(auVar139,auVar79,auVar83);
  auVar24 = vfmadd231ps_fma(auVar17,auVar232,auVar78);
  auVar23 = vfmadd231ps_fma(auVar23,auVar232,auVar84);
  auVar25 = vfmadd231ps_fma(auVar83,auVar80,auVar232);
  auVar270._4_4_ = auVar208._0_4_;
  auVar270._0_4_ = auVar208._0_4_;
  auVar270._8_4_ = auVar208._0_4_;
  auVar270._12_4_ = auVar208._0_4_;
  auVar83 = vshufps_avx(auVar208,auVar208,0x55);
  auVar17 = vshufps_avx(auVar208,auVar208,0xaa);
  fVar254 = auVar17._0_4_;
  auVar233._0_4_ = fVar254 * auVar16._0_4_;
  fVar157 = auVar17._4_4_;
  auVar233._4_4_ = fVar157 * auVar16._4_4_;
  fVar256 = auVar17._8_4_;
  auVar233._8_4_ = fVar256 * auVar16._8_4_;
  fVar257 = auVar17._12_4_;
  auVar233._12_4_ = fVar257 * auVar16._12_4_;
  auVar220._0_4_ = auVar223._0_4_ * fVar254;
  auVar220._4_4_ = auVar223._4_4_ * fVar157;
  auVar220._8_4_ = auVar223._8_4_ * fVar256;
  auVar220._12_4_ = auVar223._12_4_ * fVar257;
  auVar209._0_4_ = auVar82._0_4_ * fVar254;
  auVar209._4_4_ = auVar82._4_4_ * fVar157;
  auVar209._8_4_ = auVar82._8_4_ * fVar256;
  auVar209._12_4_ = auVar82._12_4_ * fVar257;
  auVar77 = vfmadd231ps_fma(auVar233,auVar83,auVar77);
  auVar16 = vfmadd231ps_fma(auVar220,auVar83,auVar81);
  auVar81 = vfmadd231ps_fma(auVar209,auVar83,auVar79);
  auVar26 = vfmadd231ps_fma(auVar77,auVar270,auVar78);
  auVar138 = vfmadd231ps_fma(auVar16,auVar270,auVar84);
  auVar251._8_4_ = 0x7fffffff;
  auVar251._0_8_ = 0x7fffffff7fffffff;
  auVar251._12_4_ = 0x7fffffff;
  auVar139 = vfmadd231ps_fma(auVar81,auVar270,auVar80);
  auVar78 = vandps_avx(auVar251,auVar24);
  auVar247._8_4_ = 0x219392ef;
  auVar247._0_8_ = 0x219392ef219392ef;
  auVar247._12_4_ = 0x219392ef;
  uVar72 = vcmpps_avx512vl(auVar78,auVar247,1);
  bVar70 = (bool)((byte)uVar72 & 1);
  auVar74._0_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar24._0_4_;
  bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar24._4_4_;
  bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar24._8_4_;
  bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar24._12_4_;
  auVar78 = vandps_avx(auVar251,auVar23);
  uVar72 = vcmpps_avx512vl(auVar78,auVar247,1);
  bVar70 = (bool)((byte)uVar72 & 1);
  auVar75._0_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar23._0_4_;
  bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar23._4_4_;
  bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar23._8_4_;
  bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar23._12_4_;
  auVar78 = vandps_avx(auVar251,auVar25);
  uVar72 = vcmpps_avx512vl(auVar78,auVar247,1);
  bVar70 = (bool)((byte)uVar72 & 1);
  auVar76._0_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar25._0_4_;
  bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar25._4_4_;
  bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar25._8_4_;
  bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar70 * 0x219392ef | (uint)!bVar70 * auVar25._12_4_;
  auVar77 = vrcp14ps_avx512vl(auVar74);
  auVar248._8_4_ = 0x3f800000;
  auVar248._0_8_ = &DAT_3f8000003f800000;
  auVar248._12_4_ = 0x3f800000;
  auVar78 = vfnmadd213ps_fma(auVar74,auVar77,auVar248);
  auVar24 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar75);
  auVar78 = vfnmadd213ps_fma(auVar75,auVar77,auVar248);
  auVar25 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar76);
  auVar78 = vfnmadd213ps_fma(auVar76,auVar77,auVar248);
  auVar22 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
  fVar254 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar68 + 0x16)) *
            *(float *)(prim + lVar68 + 0x1a);
  auVar238._4_4_ = fVar254;
  auVar238._0_4_ = fVar254;
  auVar238._8_4_ = fVar254;
  auVar238._12_4_ = fVar254;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar78 = vpmovsxwd_avx(auVar78);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar63 * 0xb + 6);
  auVar77 = vpmovsxwd_avx(auVar77);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar84 = vsubps_avx(auVar77,auVar78);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar77 = vpmovsxwd_avx(auVar16);
  auVar16 = vfmadd213ps_fma(auVar84,auVar238,auVar78);
  auVar78 = vcvtdq2ps_avx(auVar77);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar63 * 0xd + 6);
  auVar77 = vpmovsxwd_avx(auVar84);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar84 = vfmadd213ps_fma(auVar77,auVar238,auVar78);
  auVar255 = ZEXT1664(auVar84);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar63 * 0x12 + 6);
  auVar78 = vpmovsxwd_avx(auVar81);
  auVar78 = vcvtdq2ps_avx(auVar78);
  uVar72 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar63 * 2 + uVar72 + 6);
  auVar77 = vpmovsxwd_avx(auVar223);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar81 = vfmadd213ps_fma(auVar77,auVar238,auVar78);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar72 + 6);
  auVar78 = vpmovsxwd_avx(auVar80);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar63 * 0x18 + 6);
  auVar77 = vpmovsxwd_avx(auVar79);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar223 = vfmadd213ps_fma(auVar77,auVar238,auVar78);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar63 * 0x1d + 6);
  auVar78 = vpmovsxwd_avx(auVar82);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar63 + (ulong)(byte)PVar3 * 0x20 + 6);
  auVar77 = vpmovsxwd_avx(auVar83);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar80 = vfmadd213ps_fma(auVar77,auVar238,auVar78);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar3 * 0x20 - uVar63) + 6);
  auVar78 = vpmovsxwd_avx(auVar17);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar63 * 0x23 + 6);
  auVar77 = vpmovsxwd_avx(auVar23);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar77 = vfmadd213ps_fma(auVar77,auVar238,auVar78);
  auVar78 = vsubps_avx(auVar16,auVar26);
  auVar239._0_4_ = auVar24._0_4_ * auVar78._0_4_;
  auVar239._4_4_ = auVar24._4_4_ * auVar78._4_4_;
  auVar239._8_4_ = auVar24._8_4_ * auVar78._8_4_;
  auVar239._12_4_ = auVar24._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar84,auVar26);
  auVar189._0_4_ = auVar24._0_4_ * auVar78._0_4_;
  auVar189._4_4_ = auVar24._4_4_ * auVar78._4_4_;
  auVar189._8_4_ = auVar24._8_4_ * auVar78._8_4_;
  auVar189._12_4_ = auVar24._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar81,auVar138);
  auVar234._0_4_ = auVar25._0_4_ * auVar78._0_4_;
  auVar234._4_4_ = auVar25._4_4_ * auVar78._4_4_;
  auVar234._8_4_ = auVar25._8_4_ * auVar78._8_4_;
  auVar234._12_4_ = auVar25._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar223,auVar138);
  auVar166._0_4_ = auVar25._0_4_ * auVar78._0_4_;
  auVar166._4_4_ = auVar25._4_4_ * auVar78._4_4_;
  auVar166._8_4_ = auVar25._8_4_ * auVar78._8_4_;
  auVar166._12_4_ = auVar25._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar80,auVar139);
  auVar221._0_4_ = auVar22._0_4_ * auVar78._0_4_;
  auVar221._4_4_ = auVar22._4_4_ * auVar78._4_4_;
  auVar221._8_4_ = auVar22._8_4_ * auVar78._8_4_;
  auVar221._12_4_ = auVar22._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar77,auVar139);
  auVar140._0_4_ = auVar22._0_4_ * auVar78._0_4_;
  auVar140._4_4_ = auVar22._4_4_ * auVar78._4_4_;
  auVar140._8_4_ = auVar22._8_4_ * auVar78._8_4_;
  auVar140._12_4_ = auVar22._12_4_ * auVar78._12_4_;
  auVar78 = vpminsd_avx(auVar239,auVar189);
  auVar77 = vpminsd_avx(auVar234,auVar166);
  auVar78 = vmaxps_avx(auVar78,auVar77);
  auVar77 = vpminsd_avx(auVar221,auVar140);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar24._4_4_ = uVar2;
  auVar24._0_4_ = uVar2;
  auVar24._8_4_ = uVar2;
  auVar24._12_4_ = uVar2;
  auVar77 = vmaxps_avx512vl(auVar77,auVar24);
  auVar78 = vmaxps_avx(auVar78,auVar77);
  auVar25._8_4_ = 0x3f7ffffa;
  auVar25._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar25._12_4_ = 0x3f7ffffa;
  local_2f0 = vmulps_avx512vl(auVar78,auVar25);
  auVar78 = vpmaxsd_avx(auVar239,auVar189);
  auVar77 = vpmaxsd_avx(auVar234,auVar166);
  auVar78 = vminps_avx(auVar78,auVar77);
  auVar77 = vpmaxsd_avx(auVar221,auVar140);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar22._4_4_ = uVar2;
  auVar22._0_4_ = uVar2;
  auVar22._8_4_ = uVar2;
  auVar22._12_4_ = uVar2;
  auVar77 = vminps_avx512vl(auVar77,auVar22);
  auVar78 = vminps_avx(auVar78,auVar77);
  auVar26._8_4_ = 0x3f800003;
  auVar26._0_8_ = 0x3f8000033f800003;
  auVar26._12_4_ = 0x3f800003;
  auVar78 = vmulps_avx512vl(auVar78,auVar26);
  auVar77 = vpbroadcastd_avx512vl();
  uVar18 = vcmpps_avx512vl(local_2f0,auVar78,2);
  local_508 = vpcmpgtd_avx512vl(auVar77,_DAT_01ff0cf0);
  local_508 = ((byte)uVar18 & 0xf) & local_508;
  bVar70 = (char)local_508 == '\0';
  local_9f1 = !bVar70;
  if (bVar70) {
    return local_9f1;
  }
  local_4b0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_510 = prim;
LAB_01c35964:
  lVar68 = 0;
  for (uVar72 = local_508; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
    lVar68 = lVar68 + 1;
  }
  local_718 = (ulong)*(uint *)(local_510 + 2);
  pGVar4 = (context->scene->geometries).items[local_718].ptr;
  uVar72 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)*(uint *)(local_510 + lVar68 * 4 + 6) *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar254 = (pGVar4->time_range).lower;
  fVar254 = pGVar4->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar254) / ((pGVar4->time_range).upper - fVar254));
  auVar78 = vroundss_avx(ZEXT416((uint)fVar254),ZEXT416((uint)fVar254),9);
  auVar78 = vminss_avx(auVar78,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
  auVar78 = vmaxss_avx(ZEXT816(0) << 0x20,auVar78);
  fVar254 = fVar254 - auVar78._0_4_;
  _Var5 = pGVar4[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar67 = (long)(int)auVar78._0_4_ * 0x38;
  lVar68 = *(long *)(_Var5 + 0x10 + lVar67);
  lVar6 = *(long *)(_Var5 + 0x38 + lVar67);
  lVar7 = *(long *)(_Var5 + 0x48 + lVar67);
  pfVar1 = (float *)(lVar6 + uVar72 * lVar7);
  auVar141._0_4_ = fVar254 * *pfVar1;
  auVar141._4_4_ = fVar254 * pfVar1[1];
  auVar141._8_4_ = fVar254 * pfVar1[2];
  auVar141._12_4_ = fVar254 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar72 + 1) * lVar7);
  auVar167._0_4_ = fVar254 * *pfVar1;
  auVar167._4_4_ = fVar254 * pfVar1[1];
  auVar167._8_4_ = fVar254 * pfVar1[2];
  auVar167._12_4_ = fVar254 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + (uVar72 + 2) * lVar7);
  auVar190._0_4_ = fVar254 * *pfVar1;
  auVar190._4_4_ = fVar254 * pfVar1[1];
  auVar190._8_4_ = fVar254 * pfVar1[2];
  auVar190._12_4_ = fVar254 * pfVar1[3];
  pfVar1 = (float *)(lVar6 + lVar7 * (uVar72 + 3));
  auVar210._0_4_ = fVar254 * *pfVar1;
  auVar210._4_4_ = fVar254 * pfVar1[1];
  auVar210._8_4_ = fVar254 * pfVar1[2];
  auVar210._12_4_ = fVar254 * pfVar1[3];
  lVar6 = *(long *)(_Var5 + lVar67);
  fVar254 = 1.0 - fVar254;
  auVar222._4_4_ = fVar254;
  auVar222._0_4_ = fVar254;
  auVar222._8_4_ = fVar254;
  auVar222._12_4_ = fVar254;
  auVar16 = vfmadd231ps_fma(auVar141,auVar222,*(undefined1 (*) [16])(lVar6 + lVar68 * uVar72));
  auVar84 = vfmadd231ps_fma(auVar167,auVar222,*(undefined1 (*) [16])(lVar6 + lVar68 * (uVar72 + 1)))
  ;
  auVar81 = vfmadd231ps_fma(auVar190,auVar222,*(undefined1 (*) [16])(lVar6 + lVar68 * (uVar72 + 2)))
  ;
  auVar223 = vfmadd231ps_fma(auVar210,auVar222,*(undefined1 (*) [16])(lVar6 + lVar68 * (uVar72 + 3))
                            );
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar77 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar267._4_4_ = uVar2;
  auVar267._0_4_ = uVar2;
  auVar267._8_4_ = uVar2;
  auVar267._12_4_ = uVar2;
  local_3a0._16_4_ = uVar2;
  local_3a0._0_16_ = auVar267;
  local_3a0._20_4_ = uVar2;
  local_3a0._24_4_ = uVar2;
  local_3a0._28_4_ = uVar2;
  auVar269 = ZEXT3264(local_3a0);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar271._4_4_ = uVar2;
  auVar271._0_4_ = uVar2;
  auVar271._8_4_ = uVar2;
  auVar271._12_4_ = uVar2;
  local_3c0._16_4_ = uVar2;
  local_3c0._0_16_ = auVar271;
  local_3c0._20_4_ = uVar2;
  local_3c0._24_4_ = uVar2;
  local_3c0._28_4_ = uVar2;
  auVar78 = vunpcklps_avx(auVar267,auVar271);
  fVar254 = *(float *)(ray + k * 4 + 0x60);
  auVar272._4_4_ = fVar254;
  auVar272._0_4_ = fVar254;
  auVar272._8_4_ = fVar254;
  auVar272._12_4_ = fVar254;
  local_3e0._16_4_ = fVar254;
  local_3e0._0_16_ = auVar272;
  local_3e0._20_4_ = fVar254;
  local_3e0._24_4_ = fVar254;
  local_3e0._28_4_ = fVar254;
  local_650 = vinsertps_avx(auVar78,auVar272,0x28);
  auVar261 = ZEXT1664(local_650);
  auVar235._0_4_ = auVar16._0_4_ + auVar84._0_4_ + auVar81._0_4_ + auVar223._0_4_;
  auVar235._4_4_ = auVar16._4_4_ + auVar84._4_4_ + auVar81._4_4_ + auVar223._4_4_;
  auVar235._8_4_ = auVar16._8_4_ + auVar84._8_4_ + auVar81._8_4_ + auVar223._8_4_;
  auVar235._12_4_ = auVar16._12_4_ + auVar84._12_4_ + auVar81._12_4_ + auVar223._12_4_;
  auVar27._8_4_ = 0x3e800000;
  auVar27._0_8_ = 0x3e8000003e800000;
  auVar27._12_4_ = 0x3e800000;
  auVar78 = vmulps_avx512vl(auVar235,auVar27);
  auVar78 = vsubps_avx(auVar78,auVar77);
  auVar78 = vdpps_avx(auVar78,local_650,0x7f);
  fVar157 = *(float *)(ray + k * 4 + 0x30);
  local_660 = vdpps_avx(local_650,local_650,0x7f);
  auVar266 = ZEXT1664(local_660);
  local_490 = vpbroadcastd_avx512vl();
  auVar240._4_12_ = ZEXT812(0) << 0x20;
  auVar240._0_4_ = local_660._0_4_;
  auVar79 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar240);
  auVar80 = vfnmadd213ss_fma(auVar79,local_660,ZEXT416(0x40000000));
  local_200 = auVar78._0_4_ * auVar79._0_4_ * auVar80._0_4_;
  auVar236 = ZEXT464((uint)local_200);
  auVar241._4_4_ = local_200;
  auVar241._0_4_ = local_200;
  auVar241._8_4_ = local_200;
  auVar241._12_4_ = local_200;
  fStack_6b0 = local_200;
  _local_6c0 = auVar241;
  fStack_6ac = local_200;
  fStack_6a8 = local_200;
  fStack_6a4 = local_200;
  auVar78 = vfmadd231ps_fma(auVar77,local_650,auVar241);
  auVar78 = vblendps_avx(auVar78,ZEXT816(0) << 0x40,8);
  auVar77 = vsubps_avx(auVar16,auVar78);
  auVar16 = vsubps_avx(auVar81,auVar78);
  auVar84 = vsubps_avx(auVar84,auVar78);
  auVar253 = ZEXT1664(auVar84);
  auVar78 = vsubps_avx(auVar223,auVar78);
  auVar219 = ZEXT3264(_DAT_02020f20);
  local_780 = vbroadcastss_avx512vl(auVar77);
  auVar274 = ZEXT3264(local_780);
  auVar86._8_4_ = 1;
  auVar86._0_8_ = 0x100000001;
  auVar86._12_4_ = 1;
  auVar86._16_4_ = 1;
  auVar86._20_4_ = 1;
  auVar86._24_4_ = 1;
  auVar86._28_4_ = 1;
  local_5e0 = ZEXT1632(auVar77);
  local_8c0 = vpermps_avx512vl(auVar86,local_5e0);
  auVar275 = ZEXT3264(local_8c0);
  auVar87._8_4_ = 2;
  auVar87._0_8_ = 0x200000002;
  auVar87._12_4_ = 2;
  auVar87._16_4_ = 2;
  auVar87._20_4_ = 2;
  auVar87._24_4_ = 2;
  auVar87._28_4_ = 2;
  local_8e0 = vpermps_avx512vl(auVar87,local_5e0);
  auVar276 = ZEXT3264(local_8e0);
  auVar88._8_4_ = 3;
  auVar88._0_8_ = 0x300000003;
  auVar88._12_4_ = 3;
  auVar88._16_4_ = 3;
  auVar88._20_4_ = 3;
  auVar88._24_4_ = 3;
  auVar88._28_4_ = 3;
  local_7a0 = vpermps_avx512vl(auVar88,local_5e0);
  auVar277 = ZEXT3264(local_7a0);
  local_7c0 = vbroadcastss_avx512vl(auVar84);
  auVar278 = ZEXT3264(local_7c0);
  local_620 = ZEXT1632(auVar84);
  local_7e0 = vpermps_avx512vl(auVar86,local_620);
  auVar279 = ZEXT3264(local_7e0);
  local_900 = vpermps_avx512vl(auVar87,local_620);
  auVar280 = ZEXT3264(local_900);
  local_920 = vpermps_avx512vl(auVar88,local_620);
  auVar281 = ZEXT3264(local_920);
  local_800 = vbroadcastss_avx512vl(auVar16);
  auVar282 = ZEXT3264(local_800);
  local_600 = ZEXT1632(auVar16);
  local_820 = vpermps_avx512vl(auVar86,local_600);
  auVar283 = ZEXT3264(local_820);
  local_840 = vpermps_avx512vl(auVar87,local_600);
  auVar284 = ZEXT3264(local_840);
  local_860 = vpermps_avx512vl(auVar88,local_600);
  auVar285 = ZEXT3264(local_860);
  local_6e0 = vbroadcastss_avx512vl(auVar78);
  auVar286 = ZEXT3264(local_6e0);
  _local_640 = ZEXT1632(auVar78);
  local_880 = vpermps_avx512vl(auVar86,_local_640);
  auVar287 = ZEXT3264(local_880);
  local_2c0 = vpermps_avx512vl(auVar87,_local_640);
  local_240 = vpermps_avx2(auVar88,_local_640);
  auVar204 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  auVar78 = vfmadd231ps_fma(ZEXT432((uint)(fVar254 * fVar254)),local_3c0,local_3c0);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_3a0,local_3a0);
  local_1e0._0_4_ = auVar78._0_4_;
  local_1e0._4_4_ = local_1e0._0_4_;
  local_1e0._8_4_ = local_1e0._0_4_;
  local_1e0._12_4_ = local_1e0._0_4_;
  local_1e0._16_4_ = local_1e0._0_4_;
  local_1e0._20_4_ = local_1e0._0_4_;
  local_1e0._24_4_ = local_1e0._0_4_;
  local_1e0._28_4_ = local_1e0._0_4_;
  auVar94._8_4_ = 0x7fffffff;
  auVar94._0_8_ = 0x7fffffff7fffffff;
  auVar94._12_4_ = 0x7fffffff;
  auVar94._16_4_ = 0x7fffffff;
  auVar94._20_4_ = 0x7fffffff;
  auVar94._24_4_ = 0x7fffffff;
  auVar94._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_1e0,auVar94);
  local_590 = ZEXT416((uint)local_200);
  local_200 = fVar157 - local_200;
  fStack_1fc = local_200;
  fStack_1f8 = local_200;
  fStack_1f4 = local_200;
  fStack_1f0 = local_200;
  fStack_1ec = local_200;
  fStack_1e8 = local_200;
  fStack_1e4 = local_200;
  bVar65 = 0;
  local_728 = 1;
  local_4a0 = vpbroadcastd_avx512vl();
  auVar78 = vsqrtss_avx(local_660,local_660);
  local_924 = auVar78._0_4_;
  auVar78 = vsqrtss_avx(local_660,local_660);
  local_928 = auVar78._0_4_;
  local_5b0 = ZEXT816(0x3f80000000000000);
  local_220 = local_2c0;
  local_720 = 0;
  do {
    auVar78 = vmovshdup_avx(local_5b0);
    fVar164 = local_5b0._0_4_;
    fVar265 = auVar78._0_4_ - fVar164;
    fVar246 = fVar265 * 0.04761905;
    auVar226._4_4_ = fVar164;
    auVar226._0_4_ = fVar164;
    auVar226._8_4_ = fVar164;
    auVar226._12_4_ = fVar164;
    auVar226._16_4_ = fVar164;
    auVar226._20_4_ = fVar164;
    auVar226._24_4_ = fVar164;
    auVar226._28_4_ = fVar164;
    local_680._4_4_ = fVar265;
    local_680._0_4_ = fVar265;
    local_680._8_4_ = fVar265;
    local_680._12_4_ = fVar265;
    local_680._16_4_ = fVar265;
    local_680._20_4_ = fVar265;
    local_680._24_4_ = fVar265;
    local_680._28_4_ = fVar265;
    auVar78 = vfmadd231ps_fma(auVar226,local_680,auVar219._0_32_);
    auVar94 = vsubps_avx(auVar204._0_32_,ZEXT1632(auVar78));
    fVar254 = auVar94._0_4_;
    fVar257 = auVar94._4_4_;
    fVar244 = auVar94._8_4_;
    fVar259 = auVar94._12_4_;
    fVar231 = auVar94._16_4_;
    fVar260 = auVar94._20_4_;
    fVar187 = auVar94._24_4_;
    fVar137 = fVar254 * fVar254 * fVar254;
    fVar158 = fVar257 * fVar257 * fVar257;
    auVar90._4_4_ = fVar158;
    auVar90._0_4_ = fVar137;
    fVar159 = fVar244 * fVar244 * fVar244;
    auVar90._8_4_ = fVar159;
    fVar160 = fVar259 * fVar259 * fVar259;
    auVar90._12_4_ = fVar160;
    fVar161 = fVar231 * fVar231 * fVar231;
    auVar90._16_4_ = fVar161;
    fVar162 = fVar260 * fVar260 * fVar260;
    auVar90._20_4_ = fVar162;
    fVar163 = fVar187 * fVar187 * fVar187;
    auVar90._24_4_ = fVar163;
    auVar90._28_4_ = fVar265;
    auVar86 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar87 = vmulps_avx512vl(auVar90,auVar86);
    fVar256 = auVar78._0_4_;
    fVar258 = auVar78._4_4_;
    fVar245 = auVar78._8_4_;
    fVar230 = auVar78._12_4_;
    fVar186 = fVar256 * fVar256 * fVar256;
    fVar205 = fVar258 * fVar258 * fVar258;
    fVar206 = fVar245 * fVar245 * fVar245;
    fVar207 = fVar230 * fVar230 * fVar230;
    auVar204._0_28_ = ZEXT1628(CONCAT412(fVar207,CONCAT48(fVar206,CONCAT44(fVar205,fVar186))));
    auVar262._0_4_ = fVar256 * fVar254;
    auVar262._4_4_ = fVar258 * fVar257;
    auVar262._8_4_ = fVar245 * fVar244;
    auVar262._12_4_ = fVar230 * fVar259;
    auVar262._16_4_ = fVar231 * 0.0;
    auVar262._20_4_ = fVar260 * 0.0;
    auVar262._28_36_ = auVar261._28_36_;
    auVar262._24_4_ = fVar187 * 0.0;
    auVar86 = vmulps_avx512vl(auVar204._0_32_,auVar86);
    fVar265 = auVar86._28_4_ + fVar265;
    fVar237 = fVar265 + auVar266._28_4_ + auVar236._28_4_;
    auVar95._4_4_ = fVar158 * 0.16666667;
    auVar95._0_4_ = fVar137 * 0.16666667;
    auVar95._8_4_ = fVar159 * 0.16666667;
    auVar95._12_4_ = fVar160 * 0.16666667;
    auVar95._16_4_ = fVar161 * 0.16666667;
    auVar95._20_4_ = fVar162 * 0.16666667;
    auVar95._24_4_ = fVar163 * 0.16666667;
    auVar95._28_4_ = fVar265;
    auVar91._4_4_ =
         (auVar262._4_4_ * fVar257 * 12.0 + auVar262._4_4_ * fVar258 * 6.0 + fVar205 + auVar87._4_4_
         ) * 0.16666667;
    auVar91._0_4_ =
         (auVar262._0_4_ * fVar254 * 12.0 + auVar262._0_4_ * fVar256 * 6.0 + fVar186 + auVar87._0_4_
         ) * 0.16666667;
    auVar91._8_4_ =
         (auVar262._8_4_ * fVar244 * 12.0 + auVar262._8_4_ * fVar245 * 6.0 + fVar206 + auVar87._8_4_
         ) * 0.16666667;
    auVar91._12_4_ =
         (auVar262._12_4_ * fVar259 * 12.0 + auVar262._12_4_ * fVar230 * 6.0 +
         fVar207 + auVar87._12_4_) * 0.16666667;
    auVar91._16_4_ =
         (auVar262._16_4_ * fVar231 * 12.0 + auVar262._16_4_ * 0.0 * 6.0 + auVar87._16_4_ + 0.0) *
         0.16666667;
    auVar91._20_4_ =
         (auVar262._20_4_ * fVar260 * 12.0 + auVar262._20_4_ * 0.0 * 6.0 + auVar87._20_4_ + 0.0) *
         0.16666667;
    auVar91._24_4_ =
         (auVar262._24_4_ * fVar187 * 12.0 + auVar262._24_4_ * 0.0 * 6.0 + auVar87._24_4_ + 0.0) *
         0.16666667;
    auVar91._28_4_ = auVar266._28_4_;
    auVar92._4_4_ =
         (auVar86._4_4_ + fVar158 + auVar262._4_4_ * fVar258 * 12.0 + auVar262._4_4_ * fVar257 * 6.0
         ) * 0.16666667;
    auVar92._0_4_ =
         (auVar86._0_4_ + fVar137 + auVar262._0_4_ * fVar256 * 12.0 + auVar262._0_4_ * fVar254 * 6.0
         ) * 0.16666667;
    auVar92._8_4_ =
         (auVar86._8_4_ + fVar159 + auVar262._8_4_ * fVar245 * 12.0 + auVar262._8_4_ * fVar244 * 6.0
         ) * 0.16666667;
    auVar92._12_4_ =
         (auVar86._12_4_ + fVar160 +
         auVar262._12_4_ * fVar230 * 12.0 + auVar262._12_4_ * fVar259 * 6.0) * 0.16666667;
    auVar92._16_4_ =
         (auVar86._16_4_ + fVar161 + auVar262._16_4_ * 0.0 * 12.0 + auVar262._16_4_ * fVar231 * 6.0)
         * 0.16666667;
    auVar92._20_4_ =
         (auVar86._20_4_ + fVar162 + auVar262._20_4_ * 0.0 * 12.0 + auVar262._20_4_ * fVar260 * 6.0)
         * 0.16666667;
    auVar92._24_4_ =
         (auVar86._24_4_ + fVar163 + auVar262._24_4_ * 0.0 * 12.0 + auVar262._24_4_ * fVar187 * 6.0)
         * 0.16666667;
    auVar92._28_4_ = auVar269._28_4_;
    auVar97._28_4_ = fVar237;
    auVar97._0_28_ =
         ZEXT1628(CONCAT412(fVar207 * 0.16666667,
                            CONCAT48(fVar206 * 0.16666667,
                                     CONCAT44(fVar205 * 0.16666667,fVar186 * 0.16666667))));
    auVar86 = vmulps_avx512vl(auVar286._0_32_,auVar97);
    auVar87 = vmulps_avx512vl(auVar287._0_32_,auVar97);
    auVar88 = vmulps_avx512vl(local_220,auVar97);
    auVar98._4_4_ = local_240._4_4_ * fVar205 * 0.16666667;
    auVar98._0_4_ = local_240._0_4_ * fVar186 * 0.16666667;
    auVar98._8_4_ = local_240._8_4_ * fVar206 * 0.16666667;
    auVar98._12_4_ = local_240._12_4_ * fVar207 * 0.16666667;
    auVar98._16_4_ = local_240._16_4_ * 0.0;
    auVar98._20_4_ = local_240._20_4_ * 0.0;
    auVar98._24_4_ = local_240._24_4_ * 0.0;
    auVar98._28_4_ = fVar237;
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar92,auVar282._0_32_);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar92,auVar283._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar92,auVar284._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar98,auVar285._0_32_,auVar92);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar91,auVar278._0_32_);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar91,auVar279._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar280._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar281._0_32_,auVar91);
    auVar90 = vfmadd231ps_avx512vl(auVar86,auVar95,auVar274._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar87,auVar95,auVar275._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar88,auVar95,auVar276._0_32_);
    auVar87 = vfmadd231ps_avx512vl(auVar89,auVar277._0_32_,auVar95);
    auVar86 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar88 = vxorps_avx512vl(auVar94,auVar86);
    auVar93 = vxorps_avx512vl(ZEXT1632(auVar78),auVar86);
    auVar112._0_4_ = auVar93._0_4_ * fVar256;
    auVar112._4_4_ = auVar93._4_4_ * fVar258;
    auVar112._8_4_ = auVar93._8_4_ * fVar245;
    auVar112._12_4_ = auVar93._12_4_ * fVar230;
    auVar112._16_4_ = auVar93._16_4_ * 0.0;
    auVar112._20_4_ = auVar93._20_4_ * 0.0;
    auVar112._24_4_ = auVar93._24_4_ * 0.0;
    auVar112._28_4_ = 0;
    auVar89._8_4_ = 0x40800000;
    auVar89._0_8_ = 0x4080000040800000;
    auVar89._12_4_ = 0x40800000;
    auVar89._16_4_ = 0x40800000;
    auVar89._20_4_ = 0x40800000;
    auVar89._24_4_ = 0x40800000;
    auVar89._28_4_ = 0x40800000;
    auVar89 = vmulps_avx512vl(auVar262._0_32_,auVar89);
    auVar86 = vsubps_avx(auVar112,auVar89);
    auVar99._4_4_ = auVar88._4_4_ * fVar257 * 0.5;
    auVar99._0_4_ = auVar88._0_4_ * fVar254 * 0.5;
    auVar99._8_4_ = auVar88._8_4_ * fVar244 * 0.5;
    auVar99._12_4_ = auVar88._12_4_ * fVar259 * 0.5;
    auVar99._16_4_ = auVar88._16_4_ * fVar231 * 0.5;
    auVar99._20_4_ = auVar88._20_4_ * fVar260 * 0.5;
    auVar99._24_4_ = auVar88._24_4_ * fVar187 * 0.5;
    auVar99._28_4_ = auVar94._28_4_;
    auVar100._4_4_ = auVar86._4_4_ * 0.5;
    auVar100._0_4_ = auVar86._0_4_ * 0.5;
    auVar100._8_4_ = auVar86._8_4_ * 0.5;
    auVar100._12_4_ = auVar86._12_4_ * 0.5;
    auVar100._16_4_ = auVar86._16_4_ * 0.5;
    auVar100._20_4_ = auVar86._20_4_ * 0.5;
    auVar100._24_4_ = auVar86._24_4_ * 0.5;
    auVar100._28_4_ = auVar86._28_4_;
    auVar105._4_4_ = (fVar257 * fVar257 + auVar89._4_4_) * 0.5;
    auVar105._0_4_ = (fVar254 * fVar254 + auVar89._0_4_) * 0.5;
    auVar105._8_4_ = (fVar244 * fVar244 + auVar89._8_4_) * 0.5;
    auVar105._12_4_ = (fVar259 * fVar259 + auVar89._12_4_) * 0.5;
    auVar105._16_4_ = (fVar231 * fVar231 + auVar89._16_4_) * 0.5;
    auVar105._20_4_ = (fVar260 * fVar260 + auVar89._20_4_) * 0.5;
    auVar105._24_4_ = (fVar187 * fVar187 + auVar89._24_4_) * 0.5;
    auVar105._28_4_ = auVar253._28_4_ + auVar89._28_4_;
    fVar254 = fVar256 * fVar256 * 0.5;
    fVar256 = fVar258 * fVar258 * 0.5;
    fVar257 = fVar245 * fVar245 * 0.5;
    fVar258 = fVar230 * fVar230 * 0.5;
    auVar106._28_4_ = auVar255._28_4_;
    auVar106._0_28_ = ZEXT1628(CONCAT412(fVar258,CONCAT48(fVar257,CONCAT44(fVar256,fVar254))));
    auVar94 = vmulps_avx512vl(auVar286._0_32_,auVar106);
    auVar86 = vmulps_avx512vl(auVar287._0_32_,auVar106);
    auVar88 = vmulps_avx512vl(local_220,auVar106);
    auVar107._4_4_ = fVar256 * local_240._4_4_;
    auVar107._0_4_ = fVar254 * local_240._0_4_;
    auVar107._8_4_ = fVar257 * local_240._8_4_;
    auVar107._12_4_ = fVar258 * local_240._12_4_;
    auVar107._16_4_ = local_240._16_4_ * 0.0;
    auVar107._20_4_ = local_240._20_4_ * 0.0;
    auVar107._24_4_ = local_240._24_4_ * 0.0;
    auVar107._28_4_ = auVar255._28_4_;
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar105,auVar282._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar105,auVar283._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar105,auVar284._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar107,auVar285._0_32_,auVar105);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar278._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar100,auVar279._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar100,auVar280._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar281._0_32_,auVar100);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar99,auVar274._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar99,auVar275._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar99,auVar276._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar277._0_32_,auVar99);
    auVar115._4_4_ = auVar94._4_4_ * fVar246;
    auVar115._0_4_ = auVar94._0_4_ * fVar246;
    auVar115._8_4_ = auVar94._8_4_ * fVar246;
    auVar115._12_4_ = auVar94._12_4_ * fVar246;
    auVar115._16_4_ = auVar94._16_4_ * fVar246;
    auVar115._20_4_ = auVar94._20_4_ * fVar246;
    auVar115._24_4_ = auVar94._24_4_ * fVar246;
    auVar115._28_4_ = auVar93._28_4_;
    auVar116._4_4_ = auVar86._4_4_ * fVar246;
    auVar116._0_4_ = auVar86._0_4_ * fVar246;
    auVar116._8_4_ = auVar86._8_4_ * fVar246;
    auVar116._12_4_ = auVar86._12_4_ * fVar246;
    auVar116._16_4_ = auVar86._16_4_ * fVar246;
    auVar116._20_4_ = auVar86._20_4_ * fVar246;
    auVar116._24_4_ = auVar86._24_4_ * fVar246;
    auVar116._28_4_ = auVar86._28_4_;
    auVar266 = ZEXT3264(auVar116);
    auVar117._4_4_ = auVar88._4_4_ * fVar246;
    auVar117._0_4_ = auVar88._0_4_ * fVar246;
    auVar117._8_4_ = auVar88._8_4_ * fVar246;
    auVar117._12_4_ = auVar88._12_4_ * fVar246;
    auVar117._16_4_ = auVar88._16_4_ * fVar246;
    auVar117._20_4_ = auVar88._20_4_ * fVar246;
    auVar117._24_4_ = auVar88._24_4_ * fVar246;
    auVar117._28_4_ = auVar88._28_4_;
    fVar254 = auVar89._0_4_ * fVar246;
    fVar256 = auVar89._4_4_ * fVar246;
    auVar108._4_4_ = fVar256;
    auVar108._0_4_ = fVar254;
    fVar257 = auVar89._8_4_ * fVar246;
    auVar108._8_4_ = fVar257;
    fVar258 = auVar89._12_4_ * fVar246;
    auVar108._12_4_ = fVar258;
    fVar244 = auVar89._16_4_ * fVar246;
    auVar108._16_4_ = fVar244;
    fVar245 = auVar89._20_4_ * fVar246;
    auVar108._20_4_ = fVar245;
    fVar246 = auVar89._24_4_ * fVar246;
    auVar108._24_4_ = fVar246;
    auVar108._28_4_ = local_240._28_4_;
    auVar78 = vxorps_avx512vl(auVar287._0_16_,auVar287._0_16_);
    auVar95 = vpermt2ps_avx512vl(auVar90,_DAT_0205fd20,ZEXT1632(auVar78));
    auVar253 = ZEXT3264(auVar95);
    auVar96 = vpermt2ps_avx512vl(auVar91,_DAT_0205fd20,ZEXT1632(auVar78));
    auVar88 = ZEXT1632(auVar78);
    auVar97 = vpermt2ps_avx512vl(auVar92,_DAT_0205fd20,auVar88);
    auVar227._0_4_ = fVar254 + auVar87._0_4_;
    auVar227._4_4_ = fVar256 + auVar87._4_4_;
    auVar227._8_4_ = fVar257 + auVar87._8_4_;
    auVar227._12_4_ = fVar258 + auVar87._12_4_;
    auVar227._16_4_ = fVar244 + auVar87._16_4_;
    auVar227._20_4_ = fVar245 + auVar87._20_4_;
    auVar227._24_4_ = fVar246 + auVar87._24_4_;
    auVar227._28_4_ = local_240._28_4_ + auVar87._28_4_;
    auVar94 = vmaxps_avx(auVar87,auVar227);
    auVar86 = vminps_avx(auVar87,auVar227);
    auVar93 = vpermt2ps_avx512vl(auVar87,_DAT_0205fd20,auVar88);
    auVar98 = vpermt2ps_avx512vl(auVar115,_DAT_0205fd20,auVar88);
    auVar99 = vpermt2ps_avx512vl(auVar116,_DAT_0205fd20,auVar88);
    auVar112 = ZEXT1632(auVar78);
    auVar100 = vpermt2ps_avx512vl(auVar117,_DAT_0205fd20,auVar112);
    auVar87 = vpermt2ps_avx512vl(auVar108,_DAT_0205fd20,auVar112);
    auVar101 = vsubps_avx512vl(auVar93,auVar87);
    auVar87 = vsubps_avx(auVar95,auVar90);
    auVar88 = vsubps_avx(auVar96,auVar91);
    auVar89 = vsubps_avx(auVar97,auVar92);
    auVar236 = ZEXT3264(auVar89);
    auVar102 = vmulps_avx512vl(auVar88,auVar117);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar116,auVar89);
    auVar103 = vmulps_avx512vl(auVar89,auVar115);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar117,auVar87);
    auVar104 = vmulps_avx512vl(auVar87,auVar116);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar115,auVar88);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar102);
    auVar103 = vmulps_avx512vl(auVar89,auVar89);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar88,auVar88);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar87,auVar87);
    auVar104 = vrcp14ps_avx512vl(auVar103);
    auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar106 = vfnmadd213ps_avx512vl(auVar104,auVar103,auVar105);
    auVar104 = vfmadd132ps_avx512vl(auVar106,auVar104,auVar104);
    auVar102 = vmulps_avx512vl(auVar102,auVar104);
    auVar106 = vmulps_avx512vl(auVar88,auVar100);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar99,auVar89);
    auVar107 = vmulps_avx512vl(auVar89,auVar98);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar100,auVar87);
    auVar108 = vmulps_avx512vl(auVar87,auVar99);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar98,auVar88);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar104 = vmulps_avx512vl(auVar106,auVar104);
    auVar102 = vmaxps_avx512vl(auVar102,auVar104);
    auVar102 = vsqrtps_avx512vl(auVar102);
    auVar104 = vmaxps_avx512vl(auVar101,auVar93);
    auVar94 = vmaxps_avx512vl(auVar94,auVar104);
    auVar104 = vaddps_avx512vl(auVar102,auVar94);
    auVar94 = vminps_avx512vl(auVar101,auVar93);
    auVar94 = vminps_avx(auVar86,auVar94);
    auVar94 = vsubps_avx512vl(auVar94,auVar102);
    auVar93._8_4_ = 0x3f800002;
    auVar93._0_8_ = 0x3f8000023f800002;
    auVar93._12_4_ = 0x3f800002;
    auVar93._16_4_ = 0x3f800002;
    auVar93._20_4_ = 0x3f800002;
    auVar93._24_4_ = 0x3f800002;
    auVar93._28_4_ = 0x3f800002;
    auVar86 = vmulps_avx512vl(auVar104,auVar93);
    auVar101._8_4_ = 0x3f7ffffc;
    auVar101._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar101._12_4_ = 0x3f7ffffc;
    auVar101._16_4_ = 0x3f7ffffc;
    auVar101._20_4_ = 0x3f7ffffc;
    auVar101._24_4_ = 0x3f7ffffc;
    auVar101._28_4_ = 0x3f7ffffc;
    auVar94 = vmulps_avx512vl(auVar94,auVar101);
    auVar110._4_4_ = auVar86._4_4_ * auVar86._4_4_;
    auVar110._0_4_ = auVar86._0_4_ * auVar86._0_4_;
    auVar110._8_4_ = auVar86._8_4_ * auVar86._8_4_;
    auVar110._12_4_ = auVar86._12_4_ * auVar86._12_4_;
    auVar110._16_4_ = auVar86._16_4_ * auVar86._16_4_;
    auVar110._20_4_ = auVar86._20_4_ * auVar86._20_4_;
    auVar110._24_4_ = auVar86._24_4_ * auVar86._24_4_;
    auVar110._28_4_ = auVar94._28_4_;
    auVar86 = vrsqrt14ps_avx512vl(auVar103);
    auVar102._8_4_ = 0xbf000000;
    auVar102._0_8_ = 0xbf000000bf000000;
    auVar102._12_4_ = 0xbf000000;
    auVar102._16_4_ = 0xbf000000;
    auVar102._20_4_ = 0xbf000000;
    auVar102._24_4_ = 0xbf000000;
    auVar102._28_4_ = 0xbf000000;
    auVar93 = vmulps_avx512vl(auVar103,auVar102);
    auVar109._4_4_ = auVar86._4_4_ * auVar93._4_4_;
    auVar109._0_4_ = auVar86._0_4_ * auVar93._0_4_;
    auVar109._8_4_ = auVar86._8_4_ * auVar93._8_4_;
    auVar109._12_4_ = auVar86._12_4_ * auVar93._12_4_;
    auVar109._16_4_ = auVar86._16_4_ * auVar93._16_4_;
    auVar109._20_4_ = auVar86._20_4_ * auVar93._20_4_;
    auVar109._24_4_ = auVar86._24_4_ * auVar93._24_4_;
    auVar109._28_4_ = auVar93._28_4_;
    auVar93 = vmulps_avx512vl(auVar86,auVar86);
    auVar93 = vmulps_avx512vl(auVar93,auVar109);
    auVar103._8_4_ = 0x3fc00000;
    auVar103._0_8_ = 0x3fc000003fc00000;
    auVar103._12_4_ = 0x3fc00000;
    auVar103._16_4_ = 0x3fc00000;
    auVar103._20_4_ = 0x3fc00000;
    auVar103._24_4_ = 0x3fc00000;
    auVar103._28_4_ = 0x3fc00000;
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar86,auVar103);
    auVar111._4_4_ = auVar93._4_4_ * auVar87._4_4_;
    auVar111._0_4_ = auVar93._0_4_ * auVar87._0_4_;
    auVar111._8_4_ = auVar93._8_4_ * auVar87._8_4_;
    auVar111._12_4_ = auVar93._12_4_ * auVar87._12_4_;
    auVar111._16_4_ = auVar93._16_4_ * auVar87._16_4_;
    auVar111._20_4_ = auVar93._20_4_ * auVar87._20_4_;
    auVar111._24_4_ = auVar93._24_4_ * auVar87._24_4_;
    auVar111._28_4_ = auVar86._28_4_;
    auVar86 = vmulps_avx512vl(auVar88,auVar93);
    auVar101 = vmulps_avx512vl(auVar89,auVar93);
    auVar102 = vsubps_avx512vl(auVar112,auVar90);
    auVar103 = vsubps_avx512vl(auVar112,auVar91);
    auVar106 = vsubps_avx512vl(auVar112,auVar92);
    auVar104 = vmulps_avx512vl(local_3e0,auVar106);
    auVar104 = vfmadd231ps_avx512vl(auVar104,local_3c0,auVar103);
    auVar104 = vfmadd231ps_avx512vl(auVar104,local_3a0,auVar102);
    auVar107 = vmulps_avx512vl(auVar106,auVar106);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,auVar103);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar102,auVar102);
    auVar108 = vmulps_avx512vl(local_3e0,auVar101);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar86,local_3c0);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar111,local_3a0);
    auVar101 = vmulps_avx512vl(auVar106,auVar101);
    auVar86 = vfmadd231ps_avx512vl(auVar101,auVar103,auVar86);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar102,auVar111);
    local_4e0 = vmulps_avx512vl(auVar108,auVar108);
    auVar101 = vsubps_avx512vl(local_1e0,local_4e0);
    auVar109 = vmulps_avx512vl(auVar108,auVar86);
    auVar104 = vsubps_avx512vl(auVar104,auVar109);
    auVar109 = vaddps_avx512vl(auVar104,auVar104);
    auVar104 = vmulps_avx512vl(auVar86,auVar86);
    local_8a0 = vsubps_avx512vl(auVar107,auVar104);
    auVar107 = vsubps_avx512vl(local_8a0,auVar110);
    local_6a0 = vmulps_avx512vl(auVar109,auVar109);
    auVar104._8_4_ = 0x40800000;
    auVar104._0_8_ = 0x4080000040800000;
    auVar104._12_4_ = 0x40800000;
    auVar104._16_4_ = 0x40800000;
    auVar104._20_4_ = 0x40800000;
    auVar104._24_4_ = 0x40800000;
    auVar104._28_4_ = 0x40800000;
    auVar104 = vmulps_avx512vl(auVar101,auVar104);
    auVar110 = vmulps_avx512vl(auVar104,auVar107);
    auVar110 = vsubps_avx512vl(local_6a0,auVar110);
    uVar72 = vcmpps_avx512vl(auVar110,auVar112,5);
    bVar61 = (byte)uVar72;
    if (bVar61 == 0) {
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar110 = vsqrtps_avx512vl(auVar110);
      auVar111 = vaddps_avx512vl(auVar101,auVar101);
      auVar112 = vrcp14ps_avx512vl(auVar111);
      auVar105 = vfnmadd213ps_avx512vl(auVar111,auVar112,auVar105);
      auVar105 = vfmadd132ps_avx512vl(auVar105,auVar112,auVar112);
      auVar31._8_4_ = 0x80000000;
      auVar31._0_8_ = 0x8000000080000000;
      auVar31._12_4_ = 0x80000000;
      auVar31._16_4_ = 0x80000000;
      auVar31._20_4_ = 0x80000000;
      auVar31._24_4_ = 0x80000000;
      auVar31._28_4_ = 0x80000000;
      auVar111 = vxorps_avx512vl(auVar109,auVar31);
      auVar111 = vsubps_avx512vl(auVar111,auVar110);
      auVar111 = vmulps_avx512vl(auVar111,auVar105);
      auVar110 = vsubps_avx512vl(auVar110,auVar109);
      auVar105 = vmulps_avx512vl(auVar110,auVar105);
      auVar110 = vfmadd213ps_avx512vl(auVar108,auVar111,auVar86);
      local_320 = vmulps_avx512vl(auVar93,auVar110);
      auVar110 = vfmadd213ps_avx512vl(auVar108,auVar105,auVar86);
      local_340 = vmulps_avx512vl(auVar93,auVar110);
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar110 = vblendmps_avx512vl(auVar110,auVar111);
      auVar113._0_4_ =
           (uint)(bVar61 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar61 & 1) * local_340._0_4_;
      bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar70 * auVar110._4_4_ | (uint)!bVar70 * local_340._4_4_;
      bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar70 * auVar110._8_4_ | (uint)!bVar70 * local_340._8_4_;
      bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar70 * auVar110._12_4_ | (uint)!bVar70 * local_340._12_4_;
      bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar113._16_4_ = (uint)bVar70 * auVar110._16_4_ | (uint)!bVar70 * local_340._16_4_;
      bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar113._20_4_ = (uint)bVar70 * auVar110._20_4_ | (uint)!bVar70 * local_340._20_4_;
      bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar113._24_4_ = (uint)bVar70 * auVar110._24_4_ | (uint)!bVar70 * local_340._24_4_;
      bVar70 = SUB81(uVar72 >> 7,0);
      auVar113._28_4_ = (uint)bVar70 * auVar110._28_4_ | (uint)!bVar70 * local_340._28_4_;
      auVar216._8_4_ = 0xff800000;
      auVar216._0_8_ = 0xff800000ff800000;
      auVar216._12_4_ = 0xff800000;
      auVar216._16_4_ = 0xff800000;
      auVar216._20_4_ = 0xff800000;
      auVar216._24_4_ = 0xff800000;
      auVar216._28_4_ = 0xff800000;
      auVar110 = vblendmps_avx512vl(auVar216,auVar105);
      auVar114._0_4_ =
           (uint)(bVar61 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar105._0_4_;
      bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar70 * auVar110._4_4_ | (uint)!bVar70 * auVar105._4_4_;
      bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar70 * auVar110._8_4_ | (uint)!bVar70 * auVar105._8_4_;
      bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar70 * auVar110._12_4_ | (uint)!bVar70 * auVar105._12_4_;
      bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar114._16_4_ = (uint)bVar70 * auVar110._16_4_ | (uint)!bVar70 * auVar105._16_4_;
      bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar114._20_4_ = (uint)bVar70 * auVar110._20_4_ | (uint)!bVar70 * auVar105._20_4_;
      bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar114._24_4_ = (uint)bVar70 * auVar110._24_4_ | (uint)!bVar70 * auVar105._24_4_;
      bVar70 = SUB81(uVar72 >> 7,0);
      auVar114._28_4_ = (uint)bVar70 * auVar110._28_4_ | (uint)!bVar70 * auVar105._28_4_;
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_4e0,auVar105);
      auVar110 = vmaxps_avx512vl(local_2c0,auVar105);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      auVar110 = vmulps_avx512vl(auVar110,auVar32);
      vandps_avx512vl(auVar101,auVar105);
      uVar63 = vcmpps_avx512vl(auVar110,auVar110,1);
      uVar72 = uVar72 & uVar63;
      bVar66 = (byte)uVar72;
      if (bVar66 != 0) {
        uVar63 = vcmpps_avx512vl(auVar107,_DAT_02020f00,2);
        auVar229._8_4_ = 0xff800000;
        auVar229._0_8_ = 0xff800000ff800000;
        auVar229._12_4_ = 0xff800000;
        auVar229._16_4_ = 0xff800000;
        auVar229._20_4_ = 0xff800000;
        auVar229._24_4_ = 0xff800000;
        auVar229._28_4_ = 0xff800000;
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar107 = vblendmps_avx512vl(auVar105,auVar229);
        bVar64 = (byte)uVar63;
        uVar73 = (uint)(bVar64 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar110._0_4_;
        bVar70 = (bool)((byte)(uVar63 >> 1) & 1);
        uVar130 = (uint)bVar70 * auVar107._4_4_ | (uint)!bVar70 * auVar110._4_4_;
        bVar70 = (bool)((byte)(uVar63 >> 2) & 1);
        uVar131 = (uint)bVar70 * auVar107._8_4_ | (uint)!bVar70 * auVar110._8_4_;
        bVar70 = (bool)((byte)(uVar63 >> 3) & 1);
        uVar132 = (uint)bVar70 * auVar107._12_4_ | (uint)!bVar70 * auVar110._12_4_;
        bVar70 = (bool)((byte)(uVar63 >> 4) & 1);
        uVar133 = (uint)bVar70 * auVar107._16_4_ | (uint)!bVar70 * auVar110._16_4_;
        bVar70 = (bool)((byte)(uVar63 >> 5) & 1);
        uVar134 = (uint)bVar70 * auVar107._20_4_ | (uint)!bVar70 * auVar110._20_4_;
        bVar70 = (bool)((byte)(uVar63 >> 6) & 1);
        uVar135 = (uint)bVar70 * auVar107._24_4_ | (uint)!bVar70 * auVar110._24_4_;
        bVar70 = SUB81(uVar63 >> 7,0);
        uVar136 = (uint)bVar70 * auVar107._28_4_ | (uint)!bVar70 * auVar110._28_4_;
        auVar113._0_4_ = (bVar66 & 1) * uVar73 | !(bool)(bVar66 & 1) * auVar113._0_4_;
        bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar113._4_4_ = bVar70 * uVar130 | !bVar70 * auVar113._4_4_;
        bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar113._8_4_ = bVar70 * uVar131 | !bVar70 * auVar113._8_4_;
        bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar113._12_4_ = bVar70 * uVar132 | !bVar70 * auVar113._12_4_;
        bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar113._16_4_ = bVar70 * uVar133 | !bVar70 * auVar113._16_4_;
        bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar113._20_4_ = bVar70 * uVar134 | !bVar70 * auVar113._20_4_;
        bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar113._24_4_ = bVar70 * uVar135 | !bVar70 * auVar113._24_4_;
        bVar70 = SUB81(uVar72 >> 7,0);
        auVar113._28_4_ = bVar70 * uVar136 | !bVar70 * auVar113._28_4_;
        auVar105 = vblendmps_avx512vl(auVar229,auVar105);
        bVar70 = (bool)((byte)(uVar63 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar63 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar63 >> 6) & 1);
        bVar15 = SUB81(uVar63 >> 7,0);
        auVar114._0_4_ =
             (uint)(bVar66 & 1) *
             ((uint)(bVar64 & 1) * auVar105._0_4_ | !(bool)(bVar64 & 1) * uVar73) |
             !(bool)(bVar66 & 1) * auVar114._0_4_;
        bVar9 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar114._4_4_ =
             (uint)bVar9 * ((uint)bVar70 * auVar105._4_4_ | !bVar70 * uVar130) |
             !bVar9 * auVar114._4_4_;
        bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar114._8_4_ =
             (uint)bVar70 * ((uint)bVar10 * auVar105._8_4_ | !bVar10 * uVar131) |
             !bVar70 * auVar114._8_4_;
        bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar114._12_4_ =
             (uint)bVar70 * ((uint)bVar11 * auVar105._12_4_ | !bVar11 * uVar132) |
             !bVar70 * auVar114._12_4_;
        bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar114._16_4_ =
             (uint)bVar70 * ((uint)bVar12 * auVar105._16_4_ | !bVar12 * uVar133) |
             !bVar70 * auVar114._16_4_;
        bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar114._20_4_ =
             (uint)bVar70 * ((uint)bVar13 * auVar105._20_4_ | !bVar13 * uVar134) |
             !bVar70 * auVar114._20_4_;
        bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar114._24_4_ =
             (uint)bVar70 * ((uint)bVar14 * auVar105._24_4_ | !bVar14 * uVar135) |
             !bVar70 * auVar114._24_4_;
        bVar70 = SUB81(uVar72 >> 7,0);
        auVar114._28_4_ =
             (uint)bVar70 * ((uint)bVar15 * auVar105._28_4_ | !bVar15 * uVar136) |
             !bVar70 * auVar114._28_4_;
        bVar61 = (~bVar66 | bVar64) & bVar61;
      }
      auVar219 = ZEXT3264(_DAT_02020f20);
    }
    if ((bVar61 & 0x7f) == 0) {
      auVar118._8_4_ = 0x3f800000;
      auVar118._0_8_ = &DAT_3f8000003f800000;
      auVar118._12_4_ = 0x3f800000;
      auVar118._16_4_ = 0x3f800000;
      auVar118._20_4_ = 0x3f800000;
      auVar118._24_4_ = 0x3f800000;
      auVar118._28_4_ = 0x3f800000;
LAB_01c36712:
      auVar269 = ZEXT3264(auVar117);
      auVar255 = ZEXT3264(auVar96);
      auVar204 = ZEXT3264(auVar118);
      auVar261 = ZEXT3264(_local_6c0);
      auVar274 = ZEXT3264(local_780);
      auVar275 = ZEXT3264(local_8c0);
      auVar276 = ZEXT3264(local_8e0);
      auVar277 = ZEXT3264(local_7a0);
      auVar278 = ZEXT3264(local_7c0);
      auVar279 = ZEXT3264(local_7e0);
      auVar280 = ZEXT3264(local_900);
      auVar281 = ZEXT3264(local_920);
      auVar282 = ZEXT3264(local_800);
      auVar283 = ZEXT3264(local_820);
      auVar284 = ZEXT3264(local_840);
      auVar285 = ZEXT3264(local_860);
      auVar286 = ZEXT3264(local_6e0);
      auVar287 = ZEXT3264(local_880);
    }
    else {
      fVar254 = *(float *)(ray + k * 4 + 0x80) - (float)local_590._0_4_;
      auVar217._4_4_ = fVar254;
      auVar217._0_4_ = fVar254;
      auVar217._8_4_ = fVar254;
      auVar217._12_4_ = fVar254;
      auVar217._16_4_ = fVar254;
      auVar217._20_4_ = fVar254;
      auVar217._24_4_ = fVar254;
      auVar217._28_4_ = fVar254;
      auVar105 = vminps_avx512vl(auVar217,auVar114);
      auVar60._4_4_ = fStack_1fc;
      auVar60._0_4_ = local_200;
      auVar60._8_4_ = fStack_1f8;
      auVar60._12_4_ = fStack_1f4;
      auVar60._16_4_ = fStack_1f0;
      auVar60._20_4_ = fStack_1ec;
      auVar60._24_4_ = fStack_1e8;
      auVar60._28_4_ = fStack_1e4;
      auVar107 = vmaxps_avx512vl(auVar60,auVar113);
      auVar106 = vmulps_avx512vl(auVar117,auVar106);
      auVar103 = vfmadd213ps_avx512vl(auVar103,auVar116,auVar106);
      auVar102 = vfmadd213ps_avx512vl(auVar102,auVar115,auVar103);
      auVar103 = vmulps_avx512vl(local_3e0,auVar117);
      auVar103 = vfmadd231ps_avx512vl(auVar103,local_3c0,auVar116);
      auVar103 = vfmadd231ps_avx512vl(auVar103,local_3a0,auVar115);
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar103,auVar106);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar18 = vcmpps_avx512vl(auVar106,auVar115,1);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar102 = vxorps_avx512vl(auVar102,auVar116);
      auVar117 = vrcp14ps_avx512vl(auVar103);
      auVar110 = vxorps_avx512vl(auVar103,auVar116);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar111 = vfnmadd213ps_avx512vl(auVar117,auVar103,auVar118);
      auVar111 = vfmadd132ps_avx512vl(auVar111,auVar117,auVar117);
      auVar111 = vmulps_avx512vl(auVar111,auVar102);
      uVar19 = vcmpps_avx512vl(auVar103,auVar110,1);
      bVar66 = (byte)uVar18 | (byte)uVar19;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar102 = vblendmps_avx512vl(auVar111,auVar112);
      auVar119._0_4_ =
           (uint)(bVar66 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar117._0_4_;
      bVar70 = (bool)(bVar66 >> 1 & 1);
      auVar119._4_4_ = (uint)bVar70 * auVar102._4_4_ | (uint)!bVar70 * auVar117._4_4_;
      bVar70 = (bool)(bVar66 >> 2 & 1);
      auVar119._8_4_ = (uint)bVar70 * auVar102._8_4_ | (uint)!bVar70 * auVar117._8_4_;
      bVar70 = (bool)(bVar66 >> 3 & 1);
      auVar119._12_4_ = (uint)bVar70 * auVar102._12_4_ | (uint)!bVar70 * auVar117._12_4_;
      bVar70 = (bool)(bVar66 >> 4 & 1);
      auVar119._16_4_ = (uint)bVar70 * auVar102._16_4_ | (uint)!bVar70 * auVar117._16_4_;
      bVar70 = (bool)(bVar66 >> 5 & 1);
      auVar119._20_4_ = (uint)bVar70 * auVar102._20_4_ | (uint)!bVar70 * auVar117._20_4_;
      bVar70 = (bool)(bVar66 >> 6 & 1);
      auVar119._24_4_ = (uint)bVar70 * auVar102._24_4_ | (uint)!bVar70 * auVar117._24_4_;
      auVar119._28_4_ =
           (uint)(bVar66 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar66 >> 7) * auVar117._28_4_;
      auVar102 = vmaxps_avx(auVar107,auVar119);
      uVar19 = vcmpps_avx512vl(auVar103,auVar110,6);
      bVar66 = (byte)uVar18 | (byte)uVar19;
      auVar117._8_4_ = 0x7f800000;
      auVar117._0_8_ = 0x7f8000007f800000;
      auVar117._12_4_ = 0x7f800000;
      auVar117._16_4_ = 0x7f800000;
      auVar117._20_4_ = 0x7f800000;
      auVar117._24_4_ = 0x7f800000;
      auVar117._28_4_ = 0x7f800000;
      auVar120._0_4_ = (uint)(bVar66 & 1) * 0x7f800000 | (uint)!(bool)(bVar66 & 1) * auVar111._0_4_;
      bVar70 = (bool)(bVar66 >> 1 & 1);
      auVar120._4_4_ = (uint)bVar70 * 0x7f800000 | (uint)!bVar70 * auVar111._4_4_;
      bVar70 = (bool)(bVar66 >> 2 & 1);
      auVar120._8_4_ = (uint)bVar70 * 0x7f800000 | (uint)!bVar70 * auVar111._8_4_;
      bVar70 = (bool)(bVar66 >> 3 & 1);
      auVar120._12_4_ = (uint)bVar70 * 0x7f800000 | (uint)!bVar70 * auVar111._12_4_;
      bVar70 = (bool)(bVar66 >> 4 & 1);
      auVar120._16_4_ = (uint)bVar70 * 0x7f800000 | (uint)!bVar70 * auVar111._16_4_;
      bVar70 = (bool)(bVar66 >> 5 & 1);
      auVar120._20_4_ = (uint)bVar70 * 0x7f800000 | (uint)!bVar70 * auVar111._20_4_;
      bVar70 = (bool)(bVar66 >> 6 & 1);
      auVar120._24_4_ = (uint)bVar70 * 0x7f800000 | (uint)!bVar70 * auVar111._24_4_;
      auVar120._28_4_ =
           (uint)(bVar66 >> 7) * 0x7f800000 | (uint)!(bool)(bVar66 >> 7) * auVar111._28_4_;
      auVar103 = vminps_avx(auVar105,auVar120);
      auVar78 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
      auVar95 = vsubps_avx512vl(ZEXT1632(auVar78),auVar95);
      auVar105 = vsubps_avx512vl(ZEXT1632(auVar78),auVar96);
      auVar107 = ZEXT1632(auVar78);
      auVar97 = vsubps_avx512vl(auVar107,auVar97);
      auVar97 = vmulps_avx512vl(auVar97,auVar100);
      auVar97 = vfnmsub231ps_avx512vl(auVar97,auVar99,auVar105);
      auVar95 = vfnmadd231ps_avx512vl(auVar97,auVar98,auVar95);
      auVar97 = vmulps_avx512vl(local_3e0,auVar100);
      auVar97 = vfnmsub231ps_avx512vl(auVar97,local_3c0,auVar99);
      auVar97 = vfnmadd231ps_avx512vl(auVar97,local_3a0,auVar98);
      vandps_avx512vl(auVar97,auVar106);
      uVar18 = vcmpps_avx512vl(auVar97,auVar115,1);
      auVar95 = vxorps_avx512vl(auVar95,auVar116);
      auVar98 = vrcp14ps_avx512vl(auVar97);
      auVar99 = vxorps_avx512vl(auVar97,auVar116);
      auVar100 = vfnmadd213ps_avx512vl(auVar98,auVar97,auVar118);
      auVar78 = vfmadd132ps_fma(auVar100,auVar98,auVar98);
      auVar266 = ZEXT1664(auVar78);
      fVar254 = auVar78._0_4_ * auVar95._0_4_;
      fVar256 = auVar78._4_4_ * auVar95._4_4_;
      auVar41._4_4_ = fVar256;
      auVar41._0_4_ = fVar254;
      fVar257 = auVar78._8_4_ * auVar95._8_4_;
      auVar41._8_4_ = fVar257;
      fVar258 = auVar78._12_4_ * auVar95._12_4_;
      auVar41._12_4_ = fVar258;
      fVar244 = auVar95._16_4_ * 0.0;
      auVar41._16_4_ = fVar244;
      fVar245 = auVar95._20_4_ * 0.0;
      auVar41._20_4_ = fVar245;
      fVar259 = auVar95._24_4_ * 0.0;
      auVar41._24_4_ = fVar259;
      auVar41._28_4_ = auVar95._28_4_;
      uVar19 = vcmpps_avx512vl(auVar97,auVar99,1);
      bVar66 = (byte)uVar18 | (byte)uVar19;
      auVar100 = vblendmps_avx512vl(auVar41,auVar112);
      auVar121._0_4_ =
           (uint)(bVar66 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar98._0_4_;
      bVar70 = (bool)(bVar66 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar70 * auVar100._4_4_ | (uint)!bVar70 * auVar98._4_4_;
      bVar70 = (bool)(bVar66 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar70 * auVar100._8_4_ | (uint)!bVar70 * auVar98._8_4_;
      bVar70 = (bool)(bVar66 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar70 * auVar100._12_4_ | (uint)!bVar70 * auVar98._12_4_;
      bVar70 = (bool)(bVar66 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar70 * auVar100._16_4_ | (uint)!bVar70 * auVar98._16_4_;
      bVar70 = (bool)(bVar66 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar70 * auVar100._20_4_ | (uint)!bVar70 * auVar98._20_4_;
      bVar70 = (bool)(bVar66 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar70 * auVar100._24_4_ | (uint)!bVar70 * auVar98._24_4_;
      auVar121._28_4_ =
           (uint)(bVar66 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar66 >> 7) * auVar98._28_4_;
      _local_500 = vmaxps_avx(auVar102,auVar121);
      uVar19 = vcmpps_avx512vl(auVar97,auVar99,6);
      bVar66 = (byte)uVar18 | (byte)uVar19;
      auVar96._0_4_ = (uint)(bVar66 & 1) * 0x7f800000 | (uint)!(bool)(bVar66 & 1) * (int)fVar254;
      bVar70 = (bool)(bVar66 >> 1 & 1);
      auVar96._4_4_ = (uint)bVar70 * 0x7f800000 | (uint)!bVar70 * (int)fVar256;
      bVar70 = (bool)(bVar66 >> 2 & 1);
      auVar96._8_4_ = (uint)bVar70 * 0x7f800000 | (uint)!bVar70 * (int)fVar257;
      bVar70 = (bool)(bVar66 >> 3 & 1);
      auVar96._12_4_ = (uint)bVar70 * 0x7f800000 | (uint)!bVar70 * (int)fVar258;
      bVar70 = (bool)(bVar66 >> 4 & 1);
      auVar96._16_4_ = (uint)bVar70 * 0x7f800000 | (uint)!bVar70 * (int)fVar244;
      bVar70 = (bool)(bVar66 >> 5 & 1);
      auVar96._20_4_ = (uint)bVar70 * 0x7f800000 | (uint)!bVar70 * (int)fVar245;
      bVar70 = (bool)(bVar66 >> 6 & 1);
      auVar96._24_4_ = (uint)bVar70 * 0x7f800000 | (uint)!bVar70 * (int)fVar259;
      auVar96._28_4_ =
           (uint)(bVar66 >> 7) * 0x7f800000 | (uint)!(bool)(bVar66 >> 7) * auVar95._28_4_;
      local_280 = vminps_avx(auVar103,auVar96);
      auVar253 = ZEXT3264(local_280);
      uVar18 = vcmpps_avx512vl(_local_500,local_280,2);
      bVar61 = bVar61 & 0x7f & (byte)uVar18;
      if (bVar61 == 0) {
        auVar219 = ZEXT3264(_DAT_02020f20);
        goto LAB_01c36712;
      }
      auVar102 = vmaxps_avx512vl(auVar107,auVar94);
      auVar94 = vminps_avx512vl(local_320,auVar118);
      auVar50 = ZEXT412(0);
      auVar103 = ZEXT1232(auVar50) << 0x20;
      auVar94 = vmaxps_avx(auVar94,ZEXT1232(auVar50) << 0x20);
      auVar95 = vminps_avx512vl(local_340,auVar118);
      auVar42._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
      auVar42._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
      auVar42._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
      auVar42._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
      auVar42._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
      auVar42._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
      auVar42._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
      auVar42._28_4_ = auVar94._28_4_ + 7.0;
      local_320 = vfmadd213ps_avx512vl(auVar42,local_680,auVar226);
      auVar94 = vmaxps_avx(auVar95,ZEXT1232(auVar50) << 0x20);
      auVar43._4_4_ = (auVar94._4_4_ + 1.0) * 0.125;
      auVar43._0_4_ = (auVar94._0_4_ + 0.0) * 0.125;
      auVar43._8_4_ = (auVar94._8_4_ + 2.0) * 0.125;
      auVar43._12_4_ = (auVar94._12_4_ + 3.0) * 0.125;
      auVar43._16_4_ = (auVar94._16_4_ + 4.0) * 0.125;
      auVar43._20_4_ = (auVar94._20_4_ + 5.0) * 0.125;
      auVar43._24_4_ = (auVar94._24_4_ + 6.0) * 0.125;
      auVar43._28_4_ = auVar94._28_4_ + 7.0;
      local_340 = vfmadd213ps_avx512vl(auVar43,local_680,auVar226);
      auVar44._4_4_ = auVar102._4_4_ * auVar102._4_4_;
      auVar44._0_4_ = auVar102._0_4_ * auVar102._0_4_;
      auVar44._8_4_ = auVar102._8_4_ * auVar102._8_4_;
      auVar44._12_4_ = auVar102._12_4_ * auVar102._12_4_;
      auVar44._16_4_ = auVar102._16_4_ * auVar102._16_4_;
      auVar44._20_4_ = auVar102._20_4_ * auVar102._20_4_;
      auVar44._24_4_ = auVar102._24_4_ * auVar102._24_4_;
      auVar44._28_4_ = local_340._28_4_;
      auVar94 = vsubps_avx(local_8a0,auVar44);
      local_980 = auVar104._0_4_;
      fStack_97c = auVar104._4_4_;
      fStack_978 = auVar104._8_4_;
      fStack_974 = auVar104._12_4_;
      fStack_970 = auVar104._16_4_;
      fStack_96c = auVar104._20_4_;
      fStack_968 = auVar104._24_4_;
      auVar45._4_4_ = auVar94._4_4_ * fStack_97c;
      auVar45._0_4_ = auVar94._0_4_ * local_980;
      auVar45._8_4_ = auVar94._8_4_ * fStack_978;
      auVar45._12_4_ = auVar94._12_4_ * fStack_974;
      auVar45._16_4_ = auVar94._16_4_ * fStack_970;
      auVar45._20_4_ = auVar94._20_4_ * fStack_96c;
      auVar45._24_4_ = auVar94._24_4_ * fStack_968;
      auVar45._28_4_ = local_340._28_4_;
      auVar102 = vsubps_avx(local_6a0,auVar45);
      uVar18 = vcmpps_avx512vl(auVar102,ZEXT1232(auVar50) << 0x20,5);
      bVar66 = (byte)uVar18;
      auVar282 = ZEXT3264(local_800);
      auVar283 = ZEXT3264(local_820);
      auVar284 = ZEXT3264(local_840);
      auVar285 = ZEXT3264(local_860);
      auVar287 = ZEXT3264(local_880);
      if (bVar66 == 0) {
        auVar86 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar204 = ZEXT864(0) << 0x20;
        auVar102 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar104 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar255 = ZEXT864(0) << 0x20;
        auVar122._8_4_ = 0x7f800000;
        auVar122._0_8_ = 0x7f8000007f800000;
        auVar122._12_4_ = 0x7f800000;
        auVar122._16_4_ = 0x7f800000;
        auVar122._20_4_ = 0x7f800000;
        auVar122._24_4_ = 0x7f800000;
        auVar122._28_4_ = 0x7f800000;
        auVar123._8_4_ = 0xff800000;
        auVar123._0_8_ = 0xff800000ff800000;
        auVar123._12_4_ = 0xff800000;
        auVar123._16_4_ = 0xff800000;
        auVar123._20_4_ = 0xff800000;
        auVar123._24_4_ = 0xff800000;
        auVar123._28_4_ = 0xff800000;
      }
      else {
        auVar77 = vxorps_avx512vl(local_4e0._0_16_,local_4e0._0_16_);
        uVar72 = vcmpps_avx512vl(auVar102,auVar107,5);
        auVar102 = vsqrtps_avx(auVar102);
        auVar228._0_4_ = auVar101._0_4_ + auVar101._0_4_;
        auVar228._4_4_ = auVar101._4_4_ + auVar101._4_4_;
        auVar228._8_4_ = auVar101._8_4_ + auVar101._8_4_;
        auVar228._12_4_ = auVar101._12_4_ + auVar101._12_4_;
        auVar228._16_4_ = auVar101._16_4_ + auVar101._16_4_;
        auVar228._20_4_ = auVar101._20_4_ + auVar101._20_4_;
        auVar228._24_4_ = auVar101._24_4_ + auVar101._24_4_;
        auVar228._28_4_ = auVar101._28_4_ + auVar101._28_4_;
        auVar103 = vrcp14ps_avx512vl(auVar228);
        auVar104 = vfnmadd213ps_avx512vl(auVar228,auVar103,auVar118);
        auVar78 = vfmadd132ps_fma(auVar104,auVar103,auVar103);
        auVar33._8_4_ = 0x80000000;
        auVar33._0_8_ = 0x8000000080000000;
        auVar33._12_4_ = 0x80000000;
        auVar33._16_4_ = 0x80000000;
        auVar33._20_4_ = 0x80000000;
        auVar33._24_4_ = 0x80000000;
        auVar33._28_4_ = 0x80000000;
        auVar103 = vxorps_avx512vl(auVar109,auVar33);
        auVar103 = vsubps_avx(auVar103,auVar102);
        auVar46._4_4_ = auVar103._4_4_ * auVar78._4_4_;
        auVar46._0_4_ = auVar103._0_4_ * auVar78._0_4_;
        auVar46._8_4_ = auVar103._8_4_ * auVar78._8_4_;
        auVar46._12_4_ = auVar103._12_4_ * auVar78._12_4_;
        auVar46._16_4_ = auVar103._16_4_ * 0.0;
        auVar46._20_4_ = auVar103._20_4_ * 0.0;
        auVar46._24_4_ = auVar103._24_4_ * 0.0;
        auVar46._28_4_ = 0x3e000000;
        auVar102 = vsubps_avx512vl(auVar102,auVar109);
        auVar47._4_4_ = auVar102._4_4_ * auVar78._4_4_;
        auVar47._0_4_ = auVar102._0_4_ * auVar78._0_4_;
        auVar47._8_4_ = auVar102._8_4_ * auVar78._8_4_;
        auVar47._12_4_ = auVar102._12_4_ * auVar78._12_4_;
        auVar47._16_4_ = auVar102._16_4_ * 0.0;
        auVar47._20_4_ = auVar102._20_4_ * 0.0;
        auVar47._24_4_ = auVar102._24_4_ * 0.0;
        auVar47._28_4_ = fVar164;
        auVar102 = vfmadd213ps_avx512vl(auVar108,auVar46,auVar86);
        auVar48._4_4_ = auVar93._4_4_ * auVar102._4_4_;
        auVar48._0_4_ = auVar93._0_4_ * auVar102._0_4_;
        auVar48._8_4_ = auVar93._8_4_ * auVar102._8_4_;
        auVar48._12_4_ = auVar93._12_4_ * auVar102._12_4_;
        auVar48._16_4_ = auVar93._16_4_ * auVar102._16_4_;
        auVar48._20_4_ = auVar93._20_4_ * auVar102._20_4_;
        auVar48._24_4_ = auVar93._24_4_ * auVar102._24_4_;
        auVar48._28_4_ = auVar103._28_4_;
        auVar102 = vmulps_avx512vl(local_3a0,auVar46);
        auVar103 = vmulps_avx512vl(local_3c0,auVar46);
        auVar95 = vmulps_avx512vl(local_3e0,auVar46);
        auVar104 = vfmadd213ps_avx512vl(auVar87,auVar48,auVar90);
        auVar102 = vsubps_avx512vl(auVar102,auVar104);
        auVar104 = vfmadd213ps_avx512vl(auVar88,auVar48,auVar91);
        auVar104 = vsubps_avx512vl(auVar103,auVar104);
        auVar78 = vfmadd213ps_fma(auVar48,auVar89,auVar92);
        auVar103 = vsubps_avx(auVar95,ZEXT1632(auVar78));
        auVar255 = ZEXT3264(auVar103);
        auVar86 = vfmadd213ps_avx512vl(auVar108,auVar47,auVar86);
        auVar93 = vmulps_avx512vl(auVar93,auVar86);
        auVar86 = vmulps_avx512vl(local_3a0,auVar47);
        auVar95 = vmulps_avx512vl(local_3c0,auVar47);
        auVar97 = vmulps_avx512vl(local_3e0,auVar47);
        auVar78 = vfmadd213ps_fma(auVar87,auVar93,auVar90);
        auVar103 = vsubps_avx(auVar86,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar88,auVar93,auVar91);
        auVar86 = vsubps_avx512vl(auVar95,ZEXT1632(auVar78));
        auVar78 = vfmadd213ps_fma(auVar89,auVar93,auVar92);
        auVar87 = vsubps_avx512vl(auVar97,ZEXT1632(auVar78));
        auVar204 = ZEXT3264(auVar87);
        auVar148._8_4_ = 0x7f800000;
        auVar148._0_8_ = 0x7f8000007f800000;
        auVar148._12_4_ = 0x7f800000;
        auVar148._16_4_ = 0x7f800000;
        auVar148._20_4_ = 0x7f800000;
        auVar148._24_4_ = 0x7f800000;
        auVar148._28_4_ = 0x7f800000;
        auVar87 = vblendmps_avx512vl(auVar148,auVar46);
        bVar70 = (bool)((byte)uVar72 & 1);
        auVar122._0_4_ = (uint)bVar70 * auVar87._0_4_ | (uint)!bVar70 * auVar90._0_4_;
        bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar70 * auVar87._4_4_ | (uint)!bVar70 * auVar90._4_4_;
        bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar70 * auVar87._8_4_ | (uint)!bVar70 * auVar90._8_4_;
        bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar70 * auVar87._12_4_ | (uint)!bVar70 * auVar90._12_4_;
        bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar122._16_4_ = (uint)bVar70 * auVar87._16_4_ | (uint)!bVar70 * auVar90._16_4_;
        bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar122._20_4_ = (uint)bVar70 * auVar87._20_4_ | (uint)!bVar70 * auVar90._20_4_;
        bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar122._24_4_ = (uint)bVar70 * auVar87._24_4_ | (uint)!bVar70 * auVar90._24_4_;
        bVar70 = SUB81(uVar72 >> 7,0);
        auVar122._28_4_ = (uint)bVar70 * auVar87._28_4_ | (uint)!bVar70 * auVar90._28_4_;
        auVar149._8_4_ = 0xff800000;
        auVar149._0_8_ = 0xff800000ff800000;
        auVar149._12_4_ = 0xff800000;
        auVar149._16_4_ = 0xff800000;
        auVar149._20_4_ = 0xff800000;
        auVar149._24_4_ = 0xff800000;
        auVar149._28_4_ = 0xff800000;
        auVar87 = vblendmps_avx512vl(auVar149,auVar47);
        bVar70 = (bool)((byte)uVar72 & 1);
        auVar123._0_4_ = (uint)bVar70 * auVar87._0_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar123._4_4_ = (uint)bVar70 * auVar87._4_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar123._8_4_ = (uint)bVar70 * auVar87._8_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar123._12_4_ = (uint)bVar70 * auVar87._12_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar123._16_4_ = (uint)bVar70 * auVar87._16_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar123._20_4_ = (uint)bVar70 * auVar87._20_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar123._24_4_ = (uint)bVar70 * auVar87._24_4_ | (uint)!bVar70 * -0x800000;
        bVar70 = SUB81(uVar72 >> 7,0);
        auVar123._28_4_ = (uint)bVar70 * auVar87._28_4_ | (uint)!bVar70 * -0x800000;
        auVar249._8_4_ = 0x7fffffff;
        auVar249._0_8_ = 0x7fffffff7fffffff;
        auVar249._12_4_ = 0x7fffffff;
        auVar249._16_4_ = 0x7fffffff;
        auVar249._20_4_ = 0x7fffffff;
        auVar249._24_4_ = 0x7fffffff;
        auVar249._28_4_ = 0x7fffffff;
        auVar87 = vandps_avx(auVar249,local_4e0);
        auVar87 = vmaxps_avx(local_2c0,auVar87);
        auVar34._8_4_ = 0x36000000;
        auVar34._0_8_ = 0x3600000036000000;
        auVar34._12_4_ = 0x36000000;
        auVar34._16_4_ = 0x36000000;
        auVar34._20_4_ = 0x36000000;
        auVar34._24_4_ = 0x36000000;
        auVar34._28_4_ = 0x36000000;
        auVar88 = vmulps_avx512vl(auVar87,auVar34);
        auVar87 = vandps_avx(auVar101,auVar249);
        uVar63 = vcmpps_avx512vl(auVar87,auVar88,1);
        uVar72 = uVar72 & uVar63;
        bVar64 = (byte)uVar72;
        if (bVar64 != 0) {
          uVar63 = vcmpps_avx512vl(auVar94,ZEXT1632(auVar77),2);
          auVar250._8_4_ = 0xff800000;
          auVar250._0_8_ = 0xff800000ff800000;
          auVar250._12_4_ = 0xff800000;
          auVar250._16_4_ = 0xff800000;
          auVar250._20_4_ = 0xff800000;
          auVar250._24_4_ = 0xff800000;
          auVar250._28_4_ = 0xff800000;
          auVar264._8_4_ = 0x7f800000;
          auVar264._0_8_ = 0x7f8000007f800000;
          auVar264._12_4_ = 0x7f800000;
          auVar264._16_4_ = 0x7f800000;
          auVar264._20_4_ = 0x7f800000;
          auVar264._24_4_ = 0x7f800000;
          auVar264._28_4_ = 0x7f800000;
          auVar94 = vblendmps_avx512vl(auVar264,auVar250);
          bVar62 = (byte)uVar63;
          uVar73 = (uint)(bVar62 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar88._0_4_;
          bVar70 = (bool)((byte)(uVar63 >> 1) & 1);
          uVar130 = (uint)bVar70 * auVar94._4_4_ | (uint)!bVar70 * auVar88._4_4_;
          bVar70 = (bool)((byte)(uVar63 >> 2) & 1);
          uVar131 = (uint)bVar70 * auVar94._8_4_ | (uint)!bVar70 * auVar88._8_4_;
          bVar70 = (bool)((byte)(uVar63 >> 3) & 1);
          uVar132 = (uint)bVar70 * auVar94._12_4_ | (uint)!bVar70 * auVar88._12_4_;
          bVar70 = (bool)((byte)(uVar63 >> 4) & 1);
          uVar133 = (uint)bVar70 * auVar94._16_4_ | (uint)!bVar70 * auVar88._16_4_;
          bVar70 = (bool)((byte)(uVar63 >> 5) & 1);
          uVar134 = (uint)bVar70 * auVar94._20_4_ | (uint)!bVar70 * auVar88._20_4_;
          bVar70 = (bool)((byte)(uVar63 >> 6) & 1);
          uVar135 = (uint)bVar70 * auVar94._24_4_ | (uint)!bVar70 * auVar88._24_4_;
          bVar70 = SUB81(uVar63 >> 7,0);
          uVar136 = (uint)bVar70 * auVar94._28_4_ | (uint)!bVar70 * auVar88._28_4_;
          auVar122._0_4_ = (bVar64 & 1) * uVar73 | !(bool)(bVar64 & 1) * auVar122._0_4_;
          bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar122._4_4_ = bVar70 * uVar130 | !bVar70 * auVar122._4_4_;
          bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar122._8_4_ = bVar70 * uVar131 | !bVar70 * auVar122._8_4_;
          bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar122._12_4_ = bVar70 * uVar132 | !bVar70 * auVar122._12_4_;
          bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar122._16_4_ = bVar70 * uVar133 | !bVar70 * auVar122._16_4_;
          bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar122._20_4_ = bVar70 * uVar134 | !bVar70 * auVar122._20_4_;
          bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar122._24_4_ = bVar70 * uVar135 | !bVar70 * auVar122._24_4_;
          bVar70 = SUB81(uVar72 >> 7,0);
          auVar122._28_4_ = bVar70 * uVar136 | !bVar70 * auVar122._28_4_;
          auVar94 = vblendmps_avx512vl(auVar250,auVar264);
          bVar70 = (bool)((byte)(uVar63 >> 1) & 1);
          bVar10 = (bool)((byte)(uVar63 >> 2) & 1);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar63 >> 4) & 1);
          bVar13 = (bool)((byte)(uVar63 >> 5) & 1);
          bVar14 = (bool)((byte)(uVar63 >> 6) & 1);
          bVar15 = SUB81(uVar63 >> 7,0);
          auVar123._0_4_ =
               (uint)(bVar64 & 1) *
               ((uint)(bVar62 & 1) * auVar94._0_4_ | !(bool)(bVar62 & 1) * uVar73) |
               !(bool)(bVar64 & 1) * auVar123._0_4_;
          bVar9 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar123._4_4_ =
               (uint)bVar9 * ((uint)bVar70 * auVar94._4_4_ | !bVar70 * uVar130) |
               !bVar9 * auVar123._4_4_;
          bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar123._8_4_ =
               (uint)bVar70 * ((uint)bVar10 * auVar94._8_4_ | !bVar10 * uVar131) |
               !bVar70 * auVar123._8_4_;
          bVar70 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar123._12_4_ =
               (uint)bVar70 * ((uint)bVar11 * auVar94._12_4_ | !bVar11 * uVar132) |
               !bVar70 * auVar123._12_4_;
          bVar70 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar123._16_4_ =
               (uint)bVar70 * ((uint)bVar12 * auVar94._16_4_ | !bVar12 * uVar133) |
               !bVar70 * auVar123._16_4_;
          bVar70 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar123._20_4_ =
               (uint)bVar70 * ((uint)bVar13 * auVar94._20_4_ | !bVar13 * uVar134) |
               !bVar70 * auVar123._20_4_;
          bVar70 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar123._24_4_ =
               (uint)bVar70 * ((uint)bVar14 * auVar94._24_4_ | !bVar14 * uVar135) |
               !bVar70 * auVar123._24_4_;
          bVar70 = SUB81(uVar72 >> 7,0);
          auVar123._28_4_ =
               (uint)bVar70 * ((uint)bVar15 * auVar94._28_4_ | !bVar15 * uVar136) |
               !bVar70 * auVar123._28_4_;
          bVar66 = (~bVar64 | bVar62) & bVar66;
        }
      }
      auVar263._8_4_ = 0x7fffffff;
      auVar263._0_8_ = 0x7fffffff7fffffff;
      auVar263._12_4_ = 0x7fffffff;
      auVar275 = ZEXT3264(local_8c0);
      auVar276 = ZEXT3264(local_8e0);
      auVar280 = ZEXT3264(local_900);
      auVar281 = ZEXT3264(local_920);
      auVar286 = ZEXT3264(local_6e0);
      auVar269 = ZEXT3264(local_3e0);
      auVar219._0_4_ = local_3e0._0_4_ * auVar204._0_4_;
      auVar219._4_4_ = local_3e0._4_4_ * auVar204._4_4_;
      auVar219._8_4_ = local_3e0._8_4_ * auVar204._8_4_;
      auVar219._12_4_ = local_3e0._12_4_ * auVar204._12_4_;
      auVar219._16_4_ = local_3e0._16_4_ * auVar204._16_4_;
      auVar219._20_4_ = local_3e0._20_4_ * auVar204._20_4_;
      auVar219._28_36_ = auVar204._28_36_;
      auVar219._24_4_ = local_3e0._24_4_ * auVar204._24_4_;
      auVar266 = ZEXT3264(local_3c0);
      auVar78 = vfmadd231ps_fma(auVar219._0_32_,local_3c0,auVar86);
      auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_3a0,auVar103);
      _local_1c0 = _local_500;
      local_1a0 = vminps_avx(local_280,auVar122);
      auVar243._8_4_ = 0x7fffffff;
      auVar243._0_8_ = 0x7fffffff7fffffff;
      auVar243._12_4_ = 0x7fffffff;
      auVar243._16_4_ = 0x7fffffff;
      auVar243._20_4_ = 0x7fffffff;
      auVar243._24_4_ = 0x7fffffff;
      auVar243._28_4_ = 0x7fffffff;
      auVar94 = vandps_avx(ZEXT1632(auVar78),auVar243);
      _local_2a0 = vmaxps_avx(_local_500,auVar123);
      auVar236 = ZEXT3264(_local_2a0);
      auVar150._8_4_ = 0x3e99999a;
      auVar150._0_8_ = 0x3e99999a3e99999a;
      auVar150._12_4_ = 0x3e99999a;
      auVar150._16_4_ = 0x3e99999a;
      auVar150._20_4_ = 0x3e99999a;
      auVar150._24_4_ = 0x3e99999a;
      auVar150._28_4_ = 0x3e99999a;
      uVar18 = vcmpps_avx512vl(auVar94,auVar150,1);
      local_92c = (undefined4)uVar18;
      uVar18 = vcmpps_avx512vl(_local_500,local_1a0,2);
      bVar64 = (byte)uVar18 & bVar61;
      _local_380 = _local_2a0;
      uVar19 = vcmpps_avx512vl(_local_2a0,local_280,2);
      auVar274 = ZEXT3264(local_780);
      auVar277 = ZEXT3264(local_7a0);
      auVar278 = ZEXT3264(local_7c0);
      auVar279 = ZEXT3264(local_7e0);
      if ((bVar61 & ((byte)uVar19 | (byte)uVar18)) == 0) {
        auVar219 = ZEXT3264(_DAT_02020f20);
        auVar204 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        auVar261 = ZEXT3264(_local_6c0);
      }
      else {
        auVar49._4_4_ = local_3e0._4_4_ * auVar255._4_4_;
        auVar49._0_4_ = local_3e0._0_4_ * auVar255._0_4_;
        auVar49._8_4_ = local_3e0._8_4_ * auVar255._8_4_;
        auVar49._12_4_ = local_3e0._12_4_ * auVar255._12_4_;
        auVar49._16_4_ = local_3e0._16_4_ * auVar255._16_4_;
        auVar49._20_4_ = local_3e0._20_4_ * auVar255._20_4_;
        auVar49._24_4_ = local_3e0._24_4_ * auVar255._24_4_;
        auVar49._28_4_ = 0x3e99999a;
        auVar78 = vfmadd213ps_fma(auVar104,local_3c0,auVar49);
        auVar78 = vfmadd213ps_fma(auVar102,local_3a0,ZEXT1632(auVar78));
        auVar94 = vandps_avx(ZEXT1632(auVar78),auVar243);
        uVar18 = vcmpps_avx512vl(auVar94,auVar150,1);
        local_934 = (uint)(byte)~bVar66;
        bVar66 = (byte)uVar18 | ~bVar66;
        auVar151._8_4_ = 2;
        auVar151._0_8_ = 0x200000002;
        auVar151._12_4_ = 2;
        auVar151._16_4_ = 2;
        auVar151._20_4_ = 2;
        auVar151._24_4_ = 2;
        auVar151._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar94 = vpblendmd_avx512vl(auVar151,auVar35);
        local_260._0_4_ = (uint)(bVar66 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar66 & 1) * 2;
        bVar70 = (bool)(bVar66 >> 1 & 1);
        local_260._4_4_ = (uint)bVar70 * auVar94._4_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar66 >> 2 & 1);
        local_260._8_4_ = (uint)bVar70 * auVar94._8_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar66 >> 3 & 1);
        local_260._12_4_ = (uint)bVar70 * auVar94._12_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar66 >> 4 & 1);
        local_260._16_4_ = (uint)bVar70 * auVar94._16_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar66 >> 5 & 1);
        local_260._20_4_ = (uint)bVar70 * auVar94._20_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar66 >> 6 & 1);
        local_260._24_4_ = (uint)bVar70 * auVar94._24_4_ | (uint)!bVar70 * 2;
        local_260._28_4_ = (uint)(bVar66 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar66 >> 7) * 2;
        local_2e0 = vpbroadcastd_avx512vl();
        uVar18 = vpcmpd_avx512vl(local_2e0,local_260,5);
        local_930 = (uint)bVar64;
        bVar64 = (byte)uVar18 & bVar64;
        if (bVar64 != 0) {
          auVar77 = vminps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar78 = vmaxps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar16 = vminps_avx(local_600._0_16_,local_640._0_16_);
          auVar84 = vminps_avx(auVar77,auVar16);
          auVar77 = vmaxps_avx(local_600._0_16_,local_640._0_16_);
          auVar16 = vmaxps_avx(auVar78,auVar77);
          auVar78 = vandps_avx(auVar263,auVar84);
          auVar77 = vandps_avx(auVar263,auVar16);
          auVar78 = vmaxps_avx(auVar78,auVar77);
          auVar77 = vmovshdup_avx(auVar78);
          auVar77 = vmaxss_avx(auVar77,auVar78);
          auVar78 = vshufpd_avx(auVar78,auVar78,1);
          auVar78 = vmaxss_avx(auVar78,auVar77);
          fVar254 = auVar78._0_4_ * 1.9073486e-06;
          local_5a0 = vshufps_avx(auVar16,auVar16,0xff);
          local_360 = (float)local_500._0_4_ + (float)local_6c0._0_4_;
          fStack_35c = (float)local_500._4_4_ + (float)local_6c0._4_4_;
          fStack_358 = fStack_4f8 + fStack_6b8;
          fStack_354 = fStack_4f4 + fStack_6b4;
          fStack_350 = fStack_4f0 + fStack_6b0;
          fStack_34c = fStack_4ec + fStack_6ac;
          fStack_348 = fStack_4e8 + fStack_6a8;
          fStack_344 = fStack_4e4 + fStack_6a4;
          do {
            auVar152._8_4_ = 0x7f800000;
            auVar152._0_8_ = 0x7f8000007f800000;
            auVar152._12_4_ = 0x7f800000;
            auVar152._16_4_ = 0x7f800000;
            auVar152._20_4_ = 0x7f800000;
            auVar152._24_4_ = 0x7f800000;
            auVar152._28_4_ = 0x7f800000;
            auVar94 = vblendmps_avx512vl(auVar152,_local_500);
            auVar124._0_4_ =
                 (uint)(bVar64 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
            bVar70 = (bool)(bVar64 >> 1 & 1);
            auVar124._4_4_ = (uint)bVar70 * auVar94._4_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar64 >> 2 & 1);
            auVar124._8_4_ = (uint)bVar70 * auVar94._8_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar64 >> 3 & 1);
            auVar124._12_4_ = (uint)bVar70 * auVar94._12_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar64 >> 4 & 1);
            auVar124._16_4_ = (uint)bVar70 * auVar94._16_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar64 >> 5 & 1);
            auVar124._20_4_ = (uint)bVar70 * auVar94._20_4_ | (uint)!bVar70 * 0x7f800000;
            auVar124._24_4_ =
                 (uint)(bVar64 >> 6) * auVar94._24_4_ | (uint)!(bool)(bVar64 >> 6) * 0x7f800000;
            auVar124._28_4_ = 0x7f800000;
            auVar94 = vshufps_avx(auVar124,auVar124,0xb1);
            auVar94 = vminps_avx(auVar124,auVar94);
            auVar86 = vshufpd_avx(auVar94,auVar94,5);
            auVar94 = vminps_avx(auVar94,auVar86);
            auVar86 = vpermpd_avx2(auVar94,0x4e);
            auVar94 = vminps_avx(auVar94,auVar86);
            uVar18 = vcmpps_avx512vl(auVar124,auVar94,0);
            bVar62 = (byte)uVar18 & bVar64;
            bVar66 = bVar64;
            if (bVar62 != 0) {
              bVar66 = bVar62;
            }
            iVar21 = 0;
            for (uVar73 = (uint)bVar66; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
              iVar21 = iVar21 + 1;
            }
            bVar66 = '\x01' << ((byte)iVar21 & 0x1f);
            uVar73 = *(uint *)(local_320 + (uint)(iVar21 << 2));
            uVar130 = *(uint *)(local_1c0 + (uint)(iVar21 << 2));
            fVar256 = local_928;
            if ((float)local_660._0_4_ < 0.0) {
              fVar256 = sqrtf((float)local_660._0_4_);
            }
            auVar204 = ZEXT464(uVar73);
            auVar253 = ZEXT464(uVar130);
            bVar62 = ~bVar66;
            local_760._0_4_ = fVar256 * 1.9073486e-06;
            lVar68 = 5;
            do {
              fVar256 = auVar253._0_4_;
              auVar142._4_4_ = fVar256;
              auVar142._0_4_ = fVar256;
              auVar142._8_4_ = fVar256;
              auVar142._12_4_ = fVar256;
              auVar78 = vfmadd132ps_fma(auVar142,ZEXT816(0) << 0x40,local_650);
              fVar260 = auVar204._0_4_;
              fVar231 = 1.0 - fVar260;
              fVar244 = fVar231 * fVar231 * fVar231;
              fVar257 = fVar260 * fVar260;
              fVar230 = fVar260 * fVar257;
              auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar244),
                                        ZEXT416((uint)fVar230));
              fVar258 = fVar260 * fVar231;
              auVar223 = ZEXT416((uint)fVar231);
              auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar260 * fVar258 * 6.0)),
                                        ZEXT416((uint)(fVar258 * fVar231)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar230),
                                        ZEXT416((uint)fVar244));
              auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar258 * fVar231 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar260 * fVar258)));
              fVar244 = fVar244 * 0.16666667;
              fVar245 = (auVar77._0_4_ + auVar84._0_4_) * 0.16666667;
              fVar259 = (auVar16._0_4_ + auVar81._0_4_) * 0.16666667;
              fVar230 = fVar230 * 0.16666667;
              auVar191._0_4_ = fVar230 * (float)local_640._0_4_;
              auVar191._4_4_ = fVar230 * (float)local_640._4_4_;
              auVar191._8_4_ = fVar230 * fStack_638;
              auVar191._12_4_ = fVar230 * fStack_634;
              auVar224._4_4_ = fVar259;
              auVar224._0_4_ = fVar259;
              auVar224._8_4_ = fVar259;
              auVar224._12_4_ = fVar259;
              auVar77 = vfmadd132ps_fma(auVar224,auVar191,local_600._0_16_);
              auVar192._4_4_ = fVar245;
              auVar192._0_4_ = fVar245;
              auVar192._8_4_ = fVar245;
              auVar192._12_4_ = fVar245;
              auVar77 = vfmadd132ps_fma(auVar192,auVar77,local_620._0_16_);
              auVar168._4_4_ = fVar244;
              auVar168._0_4_ = fVar244;
              auVar168._8_4_ = fVar244;
              auVar168._12_4_ = fVar244;
              auVar77 = vfmadd132ps_fma(auVar168,auVar77,local_5e0._0_16_);
              local_4e0._0_16_ = auVar77;
              auVar78 = vsubps_avx(auVar78,auVar77);
              local_680._0_16_ = auVar78;
              auVar78 = vdpps_avx(auVar78,auVar78,0x7f);
              auVar77 = auVar204._0_16_;
              local_6a0._0_16_ = auVar78;
              if (auVar78._0_4_ < 0.0) {
                local_8a0._0_4_ = fVar257;
                auVar255._0_4_ = sqrtf(auVar78._0_4_);
                auVar255._4_60_ = extraout_var;
                auVar78 = auVar255._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
                local_8a0._0_4_ = fVar257;
              }
              local_740._4_4_ = fVar231;
              local_740._0_4_ = fVar231;
              fStack_738 = fVar231;
              fStack_734 = fVar231;
              auVar84 = vfnmsub213ss_fma(auVar77,auVar77,ZEXT416((uint)(fVar258 * 4.0)));
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar258 * 4.0)),auVar223,auVar223);
              fVar257 = fVar231 * -fVar231 * 0.5;
              fVar258 = auVar84._0_4_ * 0.5;
              fVar244 = auVar16._0_4_ * 0.5;
              local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
              auVar211._0_4_ = (float)local_8a0._0_4_ * (float)local_640._0_4_;
              auVar211._4_4_ = (float)local_8a0._0_4_ * (float)local_640._4_4_;
              auVar211._8_4_ = (float)local_8a0._0_4_ * fStack_638;
              auVar211._12_4_ = (float)local_8a0._0_4_ * fStack_634;
              auVar169._4_4_ = fVar244;
              auVar169._0_4_ = fVar244;
              auVar169._8_4_ = fVar244;
              auVar169._12_4_ = fVar244;
              auVar16 = vfmadd132ps_fma(auVar169,auVar211,local_600._0_16_);
              auVar193._4_4_ = fVar258;
              auVar193._0_4_ = fVar258;
              auVar193._8_4_ = fVar258;
              auVar193._12_4_ = fVar258;
              auVar16 = vfmadd132ps_fma(auVar193,auVar16,local_620._0_16_);
              auVar268._4_4_ = fVar257;
              auVar268._0_4_ = fVar257;
              auVar268._8_4_ = fVar257;
              auVar268._12_4_ = fVar257;
              local_8a0._0_16_ = vfmadd132ps_fma(auVar268,auVar16,local_5e0._0_16_);
              _local_520 = vdpps_avx(local_8a0._0_16_,local_8a0._0_16_,0x7f);
              auVar51._12_4_ = 0;
              auVar51._0_12_ = ZEXT812(0);
              fVar257 = local_520._0_4_;
              local_750 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar257));
              fVar258 = local_750._0_4_;
              local_530 = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar257));
              auVar16 = vfnmadd213ss_fma(local_530,_local_520,ZEXT416(0x40000000));
              local_540._0_4_ = auVar16._0_4_;
              uVar73 = auVar78._0_4_;
              if (fVar257 < -fVar257) {
                fVar244 = sqrtf(fVar257);
                auVar78 = ZEXT416(uVar73);
                auVar16 = local_8a0._0_16_;
              }
              else {
                auVar16 = vsqrtss_avx(_local_520,_local_520);
                fVar244 = auVar16._0_4_;
                auVar16 = local_8a0._0_16_;
              }
              fVar245 = local_750._0_4_;
              fVar257 = fVar258 * 1.5 + fVar257 * -0.5 * fVar245 * fVar245 * fVar245;
              local_750._0_4_ = auVar16._0_4_ * fVar257;
              local_750._4_4_ = auVar16._4_4_ * fVar257;
              local_750._8_4_ = auVar16._8_4_ * fVar257;
              local_750._12_4_ = auVar16._12_4_ * fVar257;
              auVar84 = vdpps_avx(local_680._0_16_,local_750,0x7f);
              fVar245 = auVar78._0_4_;
              auVar143._0_4_ = auVar84._0_4_ * auVar84._0_4_;
              auVar143._4_4_ = auVar84._4_4_ * auVar84._4_4_;
              auVar143._8_4_ = auVar84._8_4_ * auVar84._8_4_;
              auVar143._12_4_ = auVar84._12_4_ * auVar84._12_4_;
              auVar80 = vsubps_avx512vl(local_6a0._0_16_,auVar143);
              fVar258 = auVar80._0_4_;
              auVar170._4_12_ = ZEXT812(0) << 0x20;
              auVar170._0_4_ = fVar258;
              auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
              auVar79 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
              if (fVar258 < 0.0) {
                local_570._0_4_ = auVar79._0_4_;
                local_580 = fVar257;
                fStack_57c = fVar257;
                fStack_578 = fVar257;
                fStack_574 = fVar257;
                local_560 = auVar81;
                local_550 = auVar84;
                fVar259 = sqrtf(fVar258);
                auVar79 = ZEXT416((uint)local_570._0_4_);
                auVar78 = ZEXT416(uVar73);
                auVar16 = local_8a0._0_16_;
                auVar84 = local_550;
                auVar81 = local_560;
                fVar257 = local_580;
                fVar230 = fStack_57c;
                fVar231 = fStack_578;
                fVar187 = fStack_574;
              }
              else {
                auVar80 = vsqrtss_avx(auVar80,auVar80);
                fVar259 = auVar80._0_4_;
                fVar230 = fVar257;
                fVar231 = fVar257;
                fVar187 = fVar257;
              }
              auVar269 = ZEXT1664(auVar16);
              auVar255 = ZEXT1664(local_680._0_16_);
              auVar263._8_4_ = 0x7fffffff;
              auVar263._0_8_ = 0x7fffffff7fffffff;
              auVar263._12_4_ = 0x7fffffff;
              auVar275 = ZEXT3264(local_8c0);
              auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar223,auVar77);
              auVar77 = vfmadd231ss_fma(auVar223,auVar77,SUB6416(ZEXT464(0xc0000000),0));
              auVar194._0_4_ = fVar260 * (float)local_640._0_4_;
              auVar194._4_4_ = fVar260 * (float)local_640._4_4_;
              auVar194._8_4_ = fVar260 * fStack_638;
              auVar194._12_4_ = fVar260 * fStack_634;
              auVar212._0_4_ = auVar77._0_4_;
              auVar212._4_4_ = auVar212._0_4_;
              auVar212._8_4_ = auVar212._0_4_;
              auVar212._12_4_ = auVar212._0_4_;
              auVar77 = vfmadd132ps_fma(auVar212,auVar194,local_600._0_16_);
              auVar171._0_4_ = auVar80._0_4_;
              auVar171._4_4_ = auVar171._0_4_;
              auVar171._8_4_ = auVar171._0_4_;
              auVar171._12_4_ = auVar171._0_4_;
              auVar77 = vfmadd132ps_fma(auVar171,auVar77,local_620._0_16_);
              auVar77 = vfmadd132ps_fma(_local_740,auVar77,local_5e0._0_16_);
              auVar172._0_4_ = auVar77._0_4_ * (float)local_520._0_4_;
              auVar172._4_4_ = auVar77._4_4_ * (float)local_520._0_4_;
              auVar172._8_4_ = auVar77._8_4_ * (float)local_520._0_4_;
              auVar172._12_4_ = auVar77._12_4_ * (float)local_520._0_4_;
              auVar77 = vdpps_avx(auVar16,auVar77,0x7f);
              fVar246 = auVar77._0_4_;
              auVar195._0_4_ = auVar16._0_4_ * fVar246;
              auVar195._4_4_ = auVar16._4_4_ * fVar246;
              auVar195._8_4_ = auVar16._8_4_ * fVar246;
              auVar195._12_4_ = auVar16._12_4_ * fVar246;
              auVar77 = vsubps_avx(auVar172,auVar195);
              fVar246 = (float)local_540._0_4_ * (float)local_530._0_4_;
              auVar223 = vmaxss_avx(ZEXT416((uint)fVar254),
                                    ZEXT416((uint)(fVar256 * (float)local_760._0_4_)));
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar126._16_16_ = local_880._16_16_;
              auVar82 = vxorps_avx512vl(auVar16,auVar28);
              auVar196._0_4_ = fVar257 * auVar77._0_4_ * fVar246;
              auVar196._4_4_ = fVar230 * auVar77._4_4_ * fVar246;
              auVar196._8_4_ = fVar231 * auVar77._8_4_ * fVar246;
              auVar196._12_4_ = fVar187 * auVar77._12_4_ * fVar246;
              auVar266 = ZEXT1664(local_750);
              auVar77 = vdpps_avx(auVar82,local_750,0x7f);
              auVar80 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar254),auVar223);
              auVar78 = vdpps_avx(local_680._0_16_,auVar196,0x7f);
              auVar80 = vfmadd213ss_fma(ZEXT416((uint)(fVar245 + 1.0)),
                                        ZEXT416((uint)(fVar254 / fVar244)),auVar80);
              fVar257 = auVar77._0_4_ + auVar78._0_4_;
              auVar78 = vdpps_avx(local_650,local_750,0x7f);
              auVar77 = vdpps_avx(local_680._0_16_,auVar82,0x7f);
              auVar82 = vmulss_avx512f(auVar81,ZEXT416((uint)(fVar258 * -0.5)));
              auVar81 = vmulss_avx512f(auVar81,auVar81);
              auVar83 = vaddss_avx512f(auVar79,ZEXT416((uint)(auVar82._0_4_ * auVar81._0_4_)));
              auVar81 = vdpps_avx(local_680._0_16_,local_650,0x7f);
              auVar79 = vfnmadd231ss_fma(auVar77,auVar84,ZEXT416((uint)fVar257));
              auVar82 = vfnmadd231ss_fma(auVar81,auVar84,auVar78);
              auVar77 = vpermilps_avx(local_4e0._0_16_,0xff);
              fVar259 = fVar259 - auVar77._0_4_;
              auVar77 = vshufps_avx(auVar16,auVar16,0xff);
              auVar81 = vfmsub213ss_fma(auVar79,auVar83,auVar77);
              fVar258 = auVar82._0_4_ * auVar83._0_4_;
              auVar79 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar81._0_4_)),
                                        ZEXT416((uint)fVar257),ZEXT416((uint)fVar258));
              fVar244 = auVar79._0_4_;
              fVar258 = auVar84._0_4_ * (fVar258 / fVar244) - fVar259 * (auVar78._0_4_ / fVar244);
              auVar236 = ZEXT464((uint)fVar258);
              fVar260 = fVar260 - fVar258;
              auVar204 = ZEXT464((uint)fVar260);
              fVar256 = fVar256 - (fVar259 * (fVar257 / fVar244) -
                                  auVar84._0_4_ * (auVar81._0_4_ / fVar244));
              auVar253 = ZEXT464((uint)fVar256);
              auVar78 = vandps_avx(auVar84,auVar263);
              bVar70 = true;
              if (auVar80._0_4_ <= auVar78._0_4_) {
LAB_01c370a9:
                auVar282 = ZEXT3264(local_800);
              }
              else {
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ + auVar223._0_4_)),local_5a0,
                                          ZEXT416(0x36000000));
                auVar78 = vandps_avx(auVar263,ZEXT416((uint)fVar259));
                if (auVar84._0_4_ <= auVar78._0_4_) goto LAB_01c370a9;
                fVar256 = fVar256 + (float)local_590._0_4_;
                auVar253 = ZEXT464((uint)fVar256);
                if ((((fVar256 < fVar157) ||
                     (fVar257 = *(float *)(ray + k * 4 + 0x80), fVar257 < fVar256)) ||
                    (fVar260 < 0.0)) || (1.0 < fVar260)) {
LAB_01c370a6:
                  bVar70 = false;
                  bVar66 = 0;
                  goto LAB_01c370a9;
                }
                auVar126._0_16_ = ZEXT816(0) << 0x20;
                auVar125._4_28_ = auVar126._4_28_;
                auVar125._0_4_ = local_6a0._0_4_;
                auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar125._0_16_);
                fVar244 = auVar78._0_4_;
                auVar78 = vmulss_avx512f(local_6a0._0_16_,ZEXT416(0xbf000000));
                pGVar4 = (context->scene->geometries).items[local_718].ptr;
                if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_01c370a6;
                auVar282 = ZEXT3264(local_800);
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar66 = true;
                }
                else {
                  fVar244 = fVar244 * 1.5 + auVar78._0_4_ * fVar244 * fVar244 * fVar244;
                  auVar173._0_4_ = local_680._0_4_ * fVar244;
                  auVar173._4_4_ = local_680._4_4_ * fVar244;
                  auVar173._8_4_ = local_680._8_4_ * fVar244;
                  auVar173._12_4_ = local_680._12_4_ * fVar244;
                  auVar81 = vfmadd213ps_fma(auVar77,auVar173,auVar16);
                  auVar78 = vshufps_avx(auVar173,auVar173,0xc9);
                  auVar77 = vshufps_avx(auVar16,auVar16,0xc9);
                  auVar174._0_4_ = auVar173._0_4_ * auVar77._0_4_;
                  auVar174._4_4_ = auVar173._4_4_ * auVar77._4_4_;
                  auVar174._8_4_ = auVar173._8_4_ * auVar77._8_4_;
                  auVar174._12_4_ = auVar173._12_4_ * auVar77._12_4_;
                  auVar84 = vfmsub231ps_fma(auVar174,auVar16,auVar78);
                  auVar78 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar77 = vshufps_avx(auVar81,auVar81,0xc9);
                  auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                  auVar144._0_4_ = auVar81._0_4_ * auVar84._0_4_;
                  auVar144._4_4_ = auVar81._4_4_ * auVar84._4_4_;
                  auVar144._8_4_ = auVar81._8_4_ * auVar84._8_4_;
                  auVar144._12_4_ = auVar81._12_4_ * auVar84._12_4_;
                  auVar78 = vfmsub231ps_fma(auVar144,auVar78,auVar77);
                  local_480 = (RTCHitN  [16])vshufps_avx(auVar78,auVar78,0x55);
                  auStack_470 = vshufps_avx(auVar78,auVar78,0xaa);
                  local_460 = auVar78._0_4_;
                  uStack_45c = local_460;
                  uStack_458 = local_460;
                  uStack_454 = local_460;
                  local_450 = fVar260;
                  fStack_44c = fVar260;
                  fStack_448 = fVar260;
                  fStack_444 = fVar260;
                  local_440 = ZEXT416(0) << 0x20;
                  local_430 = local_490._0_8_;
                  uStack_428 = local_490._8_8_;
                  local_420 = local_4a0;
                  vpcmpeqd_avx2(ZEXT1632(local_4a0),ZEXT1632(local_4a0));
                  uStack_40c = context->user->instID[0];
                  local_410 = uStack_40c;
                  uStack_408 = uStack_40c;
                  uStack_404 = uStack_40c;
                  uStack_400 = context->user->instPrimID[0];
                  uStack_3fc = uStack_400;
                  uStack_3f8 = uStack_400;
                  uStack_3f4 = uStack_400;
                  *(float *)(ray + k * 4 + 0x80) = fVar256;
                  local_950 = local_4b0._0_8_;
                  uStack_948 = local_4b0._8_8_;
                  local_710.valid = (int *)&local_950;
                  local_710.geometryUserPtr = pGVar4->userPtr;
                  local_710.context = context->user;
                  local_710.hit = local_480;
                  local_710.N = 4;
                  local_710.ray = (RTCRayN *)ray;
                  if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar236 = ZEXT464((uint)fVar258);
                    auVar255 = ZEXT1664(local_680._0_16_);
                    auVar266 = ZEXT1664(local_750);
                    auVar269 = ZEXT1664(auVar16);
                    (*pGVar4->occlusionFilterN)(&local_710);
                    auVar253 = ZEXT1664(ZEXT416((uint)fVar256));
                    auVar204 = ZEXT1664(ZEXT416((uint)fVar260));
                    auVar282 = ZEXT3264(local_800);
                    auVar275 = ZEXT3264(local_8c0);
                    auVar263._8_4_ = 0x7fffffff;
                    auVar263._0_8_ = 0x7fffffff7fffffff;
                    auVar263._12_4_ = 0x7fffffff;
                  }
                  auVar54._8_8_ = uStack_948;
                  auVar54._0_8_ = local_950;
                  uVar72 = vptestmd_avx512vl(auVar54,auVar54);
                  if ((uVar72 & 0xf) == 0) {
                    bVar66 = false;
                  }
                  else {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar236 = ZEXT1664(auVar236._0_16_);
                      auVar255 = ZEXT1664(auVar255._0_16_);
                      auVar266 = ZEXT1664(auVar266._0_16_);
                      auVar269 = ZEXT1664(auVar269._0_16_);
                      (*p_Var8)(&local_710);
                      auVar253 = ZEXT1664(ZEXT416((uint)fVar256));
                      auVar204 = ZEXT1664(ZEXT416((uint)fVar260));
                      auVar282 = ZEXT3264(local_800);
                      auVar275 = ZEXT3264(local_8c0);
                      auVar263._8_4_ = 0x7fffffff;
                      auVar263._0_8_ = 0x7fffffff7fffffff;
                      auVar263._12_4_ = 0x7fffffff;
                    }
                    auVar55._8_8_ = uStack_948;
                    auVar55._0_8_ = local_950;
                    uVar72 = vptestmd_avx512vl(auVar55,auVar55);
                    uVar72 = uVar72 & 0xf;
                    auVar78 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar70 = (bool)((byte)uVar72 & 1);
                    bVar9 = (bool)((byte)(uVar72 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar72 >> 2) & 1);
                    bVar11 = SUB81(uVar72 >> 3,0);
                    *(uint *)(local_710.ray + 0x80) =
                         (uint)bVar70 * auVar78._0_4_ |
                         (uint)!bVar70 * *(int *)(local_710.ray + 0x80);
                    *(uint *)(local_710.ray + 0x84) =
                         (uint)bVar9 * auVar78._4_4_ | (uint)!bVar9 * *(int *)(local_710.ray + 0x84)
                    ;
                    *(uint *)(local_710.ray + 0x88) =
                         (uint)bVar10 * auVar78._8_4_ |
                         (uint)!bVar10 * *(int *)(local_710.ray + 0x88);
                    *(uint *)(local_710.ray + 0x8c) =
                         (uint)bVar11 * auVar78._12_4_ |
                         (uint)!bVar11 * *(int *)(local_710.ray + 0x8c);
                    bVar66 = (byte)uVar72 != 0;
                  }
                  if ((bool)bVar66 == false) {
                    *(float *)(ray + k * 4 + 0x80) = fVar257;
                  }
                }
                bVar70 = false;
              }
              if (!bVar70) goto LAB_01c3748d;
              lVar68 = lVar68 + -1;
            } while (lVar68 != 0);
            bVar66 = 0;
LAB_01c3748d:
            bVar65 = bVar65 | bVar66 & 1;
            auVar58._4_4_ = fStack_35c;
            auVar58._0_4_ = local_360;
            auVar58._8_4_ = fStack_358;
            auVar58._12_4_ = fStack_354;
            auVar58._16_4_ = fStack_350;
            auVar58._20_4_ = fStack_34c;
            auVar58._24_4_ = fStack_348;
            auVar58._28_4_ = fStack_344;
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar36._4_4_ = uVar2;
            auVar36._0_4_ = uVar2;
            auVar36._8_4_ = uVar2;
            auVar36._12_4_ = uVar2;
            auVar36._16_4_ = uVar2;
            auVar36._20_4_ = uVar2;
            auVar36._24_4_ = uVar2;
            auVar36._28_4_ = uVar2;
            uVar18 = vcmpps_avx512vl(auVar58,auVar36,2);
            bVar64 = bVar62 & bVar64 & (byte)uVar18;
            auVar283 = ZEXT3264(local_820);
          } while (bVar64 != 0);
        }
        auVar261 = ZEXT3264(_local_6c0);
        auVar153._0_4_ = local_6c0._0_4_ + (float)local_380._0_4_;
        auVar153._4_4_ = local_6c0._4_4_ + (float)local_380._4_4_;
        auVar153._8_4_ = local_6c0._8_4_ + fStack_378;
        auVar153._12_4_ = local_6c0._12_4_ + fStack_374;
        auVar153._16_4_ = local_6c0._16_4_ + fStack_370;
        auVar153._20_4_ = local_6c0._20_4_ + fStack_36c;
        auVar153._24_4_ = local_6c0._24_4_ + fStack_368;
        auVar153._28_4_ = local_6c0._28_4_ + fStack_364;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar37._4_4_ = uVar2;
        auVar37._0_4_ = uVar2;
        auVar37._8_4_ = uVar2;
        auVar37._12_4_ = uVar2;
        auVar37._16_4_ = uVar2;
        auVar37._20_4_ = uVar2;
        auVar37._24_4_ = uVar2;
        auVar37._28_4_ = uVar2;
        uVar18 = vcmpps_avx512vl(auVar153,auVar37,2);
        bVar66 = (byte)local_92c | (byte)local_934;
        bVar61 = (byte)uVar19 & bVar61 & (byte)uVar18;
        auVar154._8_4_ = 2;
        auVar154._0_8_ = 0x200000002;
        auVar154._12_4_ = 2;
        auVar154._16_4_ = 2;
        auVar154._20_4_ = 2;
        auVar154._24_4_ = 2;
        auVar154._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar94 = vpblendmd_avx512vl(auVar154,auVar38);
        local_380._0_4_ = (uint)(bVar66 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar66 & 1) * 2;
        bVar70 = (bool)(bVar66 >> 1 & 1);
        local_380._4_4_ = (uint)bVar70 * auVar94._4_4_ | (uint)!bVar70 * 2;
        bVar70 = (bool)(bVar66 >> 2 & 1);
        fStack_378 = (float)((uint)bVar70 * auVar94._8_4_ | (uint)!bVar70 * 2);
        bVar70 = (bool)(bVar66 >> 3 & 1);
        fStack_374 = (float)((uint)bVar70 * auVar94._12_4_ | (uint)!bVar70 * 2);
        bVar70 = (bool)(bVar66 >> 4 & 1);
        fStack_370 = (float)((uint)bVar70 * auVar94._16_4_ | (uint)!bVar70 * 2);
        bVar70 = (bool)(bVar66 >> 5 & 1);
        fStack_36c = (float)((uint)bVar70 * auVar94._20_4_ | (uint)!bVar70 * 2);
        bVar70 = (bool)(bVar66 >> 6 & 1);
        fStack_368 = (float)((uint)bVar70 * auVar94._24_4_ | (uint)!bVar70 * 2);
        fStack_364 = (float)((uint)(bVar66 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar66 >> 7) * 2);
        uVar18 = vpcmpd_avx512vl(_local_380,local_2e0,2);
        bVar66 = (byte)uVar18 & bVar61;
        if (bVar66 == 0) {
          auVar284 = ZEXT3264(local_840);
          auVar285 = ZEXT3264(local_860);
          auVar287 = ZEXT3264(local_880);
          auVar276 = ZEXT3264(local_8e0);
          auVar280 = ZEXT3264(local_900);
          auVar281 = ZEXT3264(local_920);
          auVar274 = ZEXT3264(local_780);
          auVar277 = ZEXT3264(local_7a0);
          auVar278 = ZEXT3264(local_7c0);
          auVar279 = ZEXT3264(local_7e0);
          auVar286 = ZEXT3264(local_6e0);
        }
        else {
          auVar77 = vminps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar78 = vmaxps_avx(local_5e0._0_16_,local_620._0_16_);
          auVar16 = vminps_avx(local_600._0_16_,local_640._0_16_);
          auVar84 = vminps_avx(auVar77,auVar16);
          auVar77 = vmaxps_avx(local_600._0_16_,local_640._0_16_);
          auVar16 = vmaxps_avx(auVar78,auVar77);
          auVar78 = vandps_avx(auVar263,auVar84);
          auVar77 = vandps_avx(auVar263,auVar16);
          auVar78 = vmaxps_avx(auVar78,auVar77);
          auVar77 = vmovshdup_avx(auVar78);
          auVar77 = vmaxss_avx(auVar77,auVar78);
          auVar78 = vshufpd_avx(auVar78,auVar78,1);
          auVar78 = vmaxss_avx(auVar78,auVar77);
          local_550._0_4_ = auVar78._0_4_ * 1.9073486e-06;
          local_5a0 = vshufps_avx(auVar16,auVar16,0xff);
          _local_500 = _local_2a0;
          local_360 = local_6c0._0_4_ + (float)local_2a0._0_4_;
          fStack_35c = local_6c0._4_4_ + (float)local_2a0._4_4_;
          fStack_358 = local_6c0._8_4_ + fStack_298;
          fStack_354 = local_6c0._12_4_ + fStack_294;
          fStack_350 = local_6c0._16_4_ + fStack_290;
          fStack_34c = local_6c0._20_4_ + fStack_28c;
          fStack_348 = local_6c0._24_4_ + fStack_288;
          fStack_344 = local_6c0._28_4_ + fStack_284;
          do {
            auVar155._8_4_ = 0x7f800000;
            auVar155._0_8_ = 0x7f8000007f800000;
            auVar155._12_4_ = 0x7f800000;
            auVar155._16_4_ = 0x7f800000;
            auVar155._20_4_ = 0x7f800000;
            auVar155._24_4_ = 0x7f800000;
            auVar155._28_4_ = 0x7f800000;
            auVar94 = vblendmps_avx512vl(auVar155,_local_500);
            auVar127._0_4_ =
                 (uint)(bVar66 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar66 & 1) * 0x7f800000;
            bVar70 = (bool)(bVar66 >> 1 & 1);
            auVar127._4_4_ = (uint)bVar70 * auVar94._4_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar66 >> 2 & 1);
            auVar127._8_4_ = (uint)bVar70 * auVar94._8_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar66 >> 3 & 1);
            auVar127._12_4_ = (uint)bVar70 * auVar94._12_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar66 >> 4 & 1);
            auVar127._16_4_ = (uint)bVar70 * auVar94._16_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)(bVar66 >> 5 & 1);
            auVar127._20_4_ = (uint)bVar70 * auVar94._20_4_ | (uint)!bVar70 * 0x7f800000;
            auVar127._24_4_ =
                 (uint)(bVar66 >> 6) * auVar94._24_4_ | (uint)!(bool)(bVar66 >> 6) * 0x7f800000;
            auVar127._28_4_ = 0x7f800000;
            auVar94 = vshufps_avx(auVar127,auVar127,0xb1);
            auVar94 = vminps_avx(auVar127,auVar94);
            auVar86 = vshufpd_avx(auVar94,auVar94,5);
            auVar94 = vminps_avx(auVar94,auVar86);
            auVar86 = vpermpd_avx2(auVar94,0x4e);
            auVar94 = vminps_avx(auVar94,auVar86);
            uVar18 = vcmpps_avx512vl(auVar127,auVar94,0);
            bVar62 = (byte)uVar18 & bVar66;
            bVar64 = bVar66;
            if (bVar62 != 0) {
              bVar64 = bVar62;
            }
            iVar21 = 0;
            for (uVar73 = (uint)bVar64; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
              iVar21 = iVar21 + 1;
            }
            bVar64 = '\x01' << ((byte)iVar21 & 0x1f);
            uVar73 = *(uint *)(local_340 + (uint)(iVar21 << 2));
            uVar130 = *(uint *)(local_280 + (uint)(iVar21 << 2));
            fVar254 = local_924;
            if ((float)local_660._0_4_ < 0.0) {
              fVar254 = sqrtf((float)local_660._0_4_);
            }
            auVar266 = ZEXT464(uVar130);
            auVar204 = ZEXT464(uVar73);
            bVar62 = ~bVar64;
            lVar68 = 5;
            do {
              fVar256 = auVar266._0_4_;
              auVar145._4_4_ = fVar256;
              auVar145._0_4_ = fVar256;
              auVar145._8_4_ = fVar256;
              auVar145._12_4_ = fVar256;
              auVar78 = vfmadd132ps_fma(auVar145,ZEXT816(0) << 0x40,local_650);
              fVar260 = auVar204._0_4_;
              fVar231 = 1.0 - fVar260;
              fVar244 = fVar231 * fVar231 * fVar231;
              fVar257 = fVar260 * fVar260;
              fVar230 = fVar260 * fVar257;
              auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar244),
                                        ZEXT416((uint)fVar230));
              fVar258 = fVar260 * fVar231;
              auVar223 = ZEXT416((uint)fVar231);
              auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar260 * fVar258 * 6.0)),
                                        ZEXT416((uint)(fVar258 * fVar231)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar230),
                                        ZEXT416((uint)fVar244));
              auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar258 * fVar231 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar260 * fVar258)));
              fVar244 = fVar244 * 0.16666667;
              fVar245 = (auVar77._0_4_ + auVar84._0_4_) * 0.16666667;
              fVar259 = (auVar16._0_4_ + auVar81._0_4_) * 0.16666667;
              fVar230 = fVar230 * 0.16666667;
              auVar197._0_4_ = fVar230 * (float)local_640._0_4_;
              auVar197._4_4_ = fVar230 * (float)local_640._4_4_;
              auVar197._8_4_ = fVar230 * fStack_638;
              auVar197._12_4_ = fVar230 * fStack_634;
              auVar225._4_4_ = fVar259;
              auVar225._0_4_ = fVar259;
              auVar225._8_4_ = fVar259;
              auVar225._12_4_ = fVar259;
              auVar77 = vfmadd132ps_fma(auVar225,auVar197,local_600._0_16_);
              auVar198._4_4_ = fVar245;
              auVar198._0_4_ = fVar245;
              auVar198._8_4_ = fVar245;
              auVar198._12_4_ = fVar245;
              auVar77 = vfmadd132ps_fma(auVar198,auVar77,local_620._0_16_);
              auVar175._4_4_ = fVar244;
              auVar175._0_4_ = fVar244;
              auVar175._8_4_ = fVar244;
              auVar175._12_4_ = fVar244;
              auVar77 = vfmadd132ps_fma(auVar175,auVar77,local_5e0._0_16_);
              local_4e0._0_16_ = auVar77;
              auVar78 = vsubps_avx(auVar78,auVar77);
              local_680._0_16_ = auVar78;
              auVar78 = vdpps_avx(auVar78,auVar78,0x7f);
              auVar77 = auVar204._0_16_;
              local_6a0._0_16_ = auVar78;
              if (auVar78._0_4_ < 0.0) {
                local_8a0._0_4_ = fVar257;
                auVar236._0_4_ = sqrtf(auVar78._0_4_);
                auVar236._4_60_ = extraout_var_00;
                auVar78 = auVar236._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
                local_8a0._0_4_ = fVar257;
              }
              local_520._4_4_ = fVar231;
              local_520._0_4_ = fVar231;
              fStack_518 = fVar231;
              fStack_514 = fVar231;
              auVar84 = vfnmsub213ss_fma(auVar77,auVar77,ZEXT416((uint)(fVar258 * 4.0)));
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar258 * 4.0)),auVar223,auVar223);
              fVar257 = fVar231 * -fVar231 * 0.5;
              fVar258 = auVar84._0_4_ * 0.5;
              fVar244 = auVar16._0_4_ * 0.5;
              local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
              auVar213._0_4_ = (float)local_8a0._0_4_ * (float)local_640._0_4_;
              auVar213._4_4_ = (float)local_8a0._0_4_ * (float)local_640._4_4_;
              auVar213._8_4_ = (float)local_8a0._0_4_ * fStack_638;
              auVar213._12_4_ = (float)local_8a0._0_4_ * fStack_634;
              auVar176._4_4_ = fVar244;
              auVar176._0_4_ = fVar244;
              auVar176._8_4_ = fVar244;
              auVar176._12_4_ = fVar244;
              auVar16 = vfmadd132ps_fma(auVar176,auVar213,local_600._0_16_);
              auVar199._4_4_ = fVar258;
              auVar199._0_4_ = fVar258;
              auVar199._8_4_ = fVar258;
              auVar199._12_4_ = fVar258;
              auVar16 = vfmadd132ps_fma(auVar199,auVar16,local_620._0_16_);
              auVar273._4_4_ = fVar257;
              auVar273._0_4_ = fVar257;
              auVar273._8_4_ = fVar257;
              auVar273._12_4_ = fVar257;
              local_8a0._0_16_ = vfmadd132ps_fma(auVar273,auVar16,local_5e0._0_16_);
              local_530 = vdpps_avx(local_8a0._0_16_,local_8a0._0_16_,0x7f);
              auVar52._12_4_ = 0;
              auVar52._0_12_ = ZEXT812(0);
              fVar257 = local_530._0_4_;
              _local_740 = vrsqrt14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar257));
              fVar258 = local_740._0_4_;
              local_540 = vrcp14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar257));
              auVar16 = vfnmadd213ss_fma(local_540,local_530,ZEXT416(0x40000000));
              local_750._0_4_ = auVar16._0_4_;
              uVar73 = auVar78._0_4_;
              if (fVar257 < -fVar257) {
                local_760._0_4_ = fVar257 * -0.5;
                fVar244 = sqrtf(fVar257);
                auVar78 = ZEXT416(uVar73);
                auVar16 = local_8a0._0_16_;
              }
              else {
                auVar16 = vsqrtss_avx(local_530,local_530);
                fVar244 = auVar16._0_4_;
                local_760._0_4_ = fVar257 * -0.5;
                auVar16 = local_8a0._0_16_;
              }
              fVar257 = local_740._0_4_;
              fVar257 = fVar258 * 1.5 + (float)local_760._0_4_ * fVar257 * fVar257 * fVar257;
              local_760._0_4_ = auVar16._0_4_ * fVar257;
              local_760._4_4_ = auVar16._4_4_ * fVar257;
              local_760._8_4_ = auVar16._8_4_ * fVar257;
              local_760._12_4_ = auVar16._12_4_ * fVar257;
              _local_740 = vdpps_avx(local_680._0_16_,local_760,0x7f);
              auVar80 = vaddss_avx512f(auVar78,ZEXT416(0x3f800000));
              auVar146._0_4_ = local_740._0_4_ * local_740._0_4_;
              auVar146._4_4_ = local_740._4_4_ * local_740._4_4_;
              auVar146._8_4_ = local_740._8_4_ * local_740._8_4_;
              auVar146._12_4_ = local_740._12_4_ * local_740._12_4_;
              auVar84 = vsubps_avx(local_6a0._0_16_,auVar146);
              fVar258 = auVar84._0_4_;
              auVar177._4_12_ = ZEXT812(0) << 0x20;
              auVar177._0_4_ = fVar258;
              auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
              auVar79 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
              uVar71 = fVar258 == 0.0;
              uVar69 = fVar258 < 0.0;
              if ((bool)uVar69) {
                local_560._0_4_ = fVar244;
                local_580 = fVar257;
                fStack_57c = fVar257;
                fStack_578 = fVar257;
                fStack_574 = fVar257;
                local_570 = auVar81;
                fVar245 = sqrtf(fVar258);
                auVar80 = ZEXT416(auVar80._0_4_);
                auVar78 = ZEXT416(uVar73);
                auVar16 = local_8a0._0_16_;
                auVar81 = local_570;
                fVar257 = local_580;
                fVar259 = fStack_57c;
                fVar230 = fStack_578;
                fVar231 = fStack_574;
                fVar244 = (float)local_560._0_4_;
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
                fVar245 = auVar84._0_4_;
                fVar259 = fVar257;
                fVar230 = fVar257;
                fVar231 = fVar257;
              }
              auVar269 = ZEXT1664(local_680._0_16_);
              auVar252._8_4_ = 0x7fffffff;
              auVar252._0_8_ = 0x7fffffff7fffffff;
              auVar252._12_4_ = 0x7fffffff;
              auVar253 = ZEXT1664(auVar252);
              auVar261 = ZEXT3264(_local_6c0);
              auVar274 = ZEXT3264(local_780);
              auVar275 = ZEXT3264(local_8c0);
              auVar276 = ZEXT3264(local_8e0);
              auVar277 = ZEXT3264(local_7a0);
              auVar278 = ZEXT3264(local_7c0);
              auVar279 = ZEXT3264(local_7e0);
              auVar280 = ZEXT3264(local_900);
              auVar281 = ZEXT3264(local_920);
              auVar282 = ZEXT3264(local_800);
              auVar283 = ZEXT3264(local_820);
              auVar284 = ZEXT3264(local_840);
              auVar285 = ZEXT3264(local_860);
              auVar286 = ZEXT3264(local_6e0);
              auVar287 = ZEXT3264(local_880);
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar223,auVar77);
              auVar77 = vfmadd231ss_fma(auVar223,auVar77,SUB6416(ZEXT464(0xc0000000),0));
              auVar200._0_4_ = fVar260 * (float)local_640._0_4_;
              auVar200._4_4_ = fVar260 * (float)local_640._4_4_;
              auVar200._8_4_ = fVar260 * fStack_638;
              auVar200._12_4_ = fVar260 * fStack_634;
              auVar214._0_4_ = auVar77._0_4_;
              auVar214._4_4_ = auVar214._0_4_;
              auVar214._8_4_ = auVar214._0_4_;
              auVar214._12_4_ = auVar214._0_4_;
              auVar77 = vfmadd132ps_fma(auVar214,auVar200,local_600._0_16_);
              auVar178._0_4_ = auVar84._0_4_;
              auVar178._4_4_ = auVar178._0_4_;
              auVar178._8_4_ = auVar178._0_4_;
              auVar178._12_4_ = auVar178._0_4_;
              auVar77 = vfmadd132ps_fma(auVar178,auVar77,local_620._0_16_);
              auVar77 = vfmadd132ps_fma(_local_520,auVar77,local_5e0._0_16_);
              auVar179._0_4_ = auVar77._0_4_ * (float)local_530._0_4_;
              auVar179._4_4_ = auVar77._4_4_ * (float)local_530._0_4_;
              auVar179._8_4_ = auVar77._8_4_ * (float)local_530._0_4_;
              auVar179._12_4_ = auVar77._12_4_ * (float)local_530._0_4_;
              auVar77 = vdpps_avx(auVar16,auVar77,0x7f);
              fVar187 = auVar77._0_4_;
              auVar201._0_4_ = auVar16._0_4_ * fVar187;
              auVar201._4_4_ = auVar16._4_4_ * fVar187;
              auVar201._8_4_ = auVar16._8_4_ * fVar187;
              auVar201._12_4_ = auVar16._12_4_ * fVar187;
              auVar77 = vsubps_avx(auVar179,auVar201);
              fVar187 = (float)local_750._0_4_ * (float)local_540._0_4_;
              auVar223 = vmaxss_avx(ZEXT416((uint)local_550._0_4_),
                                    ZEXT416((uint)(fVar256 * fVar254 * 1.9073486e-06)));
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar82 = vxorps_avx512vl(auVar16,auVar29);
              auVar202._0_4_ = fVar257 * auVar77._0_4_ * fVar187;
              auVar202._4_4_ = fVar259 * auVar77._4_4_ * fVar187;
              auVar202._8_4_ = fVar230 * auVar77._8_4_ * fVar187;
              auVar202._12_4_ = fVar231 * auVar77._12_4_ * fVar187;
              auVar255 = ZEXT1664(local_760);
              auVar77 = vdpps_avx(auVar82,local_760,0x7f);
              auVar84 = vfmadd213ss_fma(auVar78,ZEXT416((uint)local_550._0_4_),auVar223);
              auVar78 = vdpps_avx(local_680._0_16_,auVar202,0x7f);
              vfmadd213ss_avx512f(auVar80,ZEXT416((uint)((float)local_550._0_4_ / fVar244)),auVar84)
              ;
              fVar257 = auVar77._0_4_ + auVar78._0_4_;
              auVar78 = vdpps_avx(local_650,local_760,0x7f);
              auVar77 = vdpps_avx(local_680._0_16_,auVar82,0x7f);
              auVar84 = vmulss_avx512f(auVar81,ZEXT416((uint)(fVar258 * -0.5)));
              auVar81 = vmulss_avx512f(auVar81,auVar81);
              fVar258 = auVar84._0_4_ * auVar81._0_4_ + auVar79._0_4_;
              auVar84 = vdpps_avx(local_680._0_16_,local_650,0x7f);
              auVar81 = vfnmadd231ss_avx512f(auVar77,_local_740,ZEXT416((uint)fVar257));
              auVar80 = vfnmadd231ss_avx512f(auVar84,_local_740,auVar78);
              auVar77 = vpermilps_avx(local_4e0._0_16_,0xff);
              fVar245 = fVar245 - auVar77._0_4_;
              auVar77 = vshufps_avx(auVar16,auVar16,0xff);
              auVar84 = vfmsub213ss_fma(auVar81,ZEXT416((uint)fVar258),auVar77);
              fVar258 = auVar80._0_4_ * fVar258;
              auVar81 = vfmsub231ss_fma(ZEXT416((uint)(auVar78._0_4_ * auVar84._0_4_)),
                                        ZEXT416((uint)fVar257),ZEXT416((uint)fVar258));
              fVar244 = auVar81._0_4_;
              auVar242._0_4_ = fVar258 / fVar244;
              auVar242._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar215._0_4_ = auVar84._0_4_ / fVar244;
              auVar215._4_12_ = auVar84._4_12_;
              auVar84 = vmulss_avx512f(_local_740,auVar242);
              fVar258 = auVar84._0_4_ - fVar245 * (auVar78._0_4_ / fVar244);
              auVar236 = ZEXT464((uint)fVar258);
              auVar78 = vmulss_avx512f(_local_740,auVar215);
              fVar260 = fVar260 - fVar258;
              auVar204 = ZEXT464((uint)fVar260);
              fVar256 = fVar256 - (fVar245 * (fVar257 / fVar244) - auVar78._0_4_);
              auVar266 = ZEXT464((uint)fVar256);
              auVar78 = vandps_avx512vl(_local_740,auVar252);
              auVar78 = vucomiss_avx512f(auVar78);
              bVar70 = true;
              if (!(bool)uVar69 && !(bool)uVar71) {
                auVar78 = vaddss_avx512f(auVar223,auVar78);
                auVar84 = vfmadd231ss_fma(auVar78,local_5a0,ZEXT416(0x36000000));
                auVar78 = vandps_avx(auVar252,ZEXT416((uint)fVar245));
                if (auVar78._0_4_ < auVar84._0_4_) {
                  fVar256 = fVar256 + (float)local_590._0_4_;
                  auVar266 = ZEXT464((uint)fVar256);
                  if ((((fVar157 <= fVar256) &&
                       (fVar257 = *(float *)(ray + k * 4 + 0x80), fVar256 <= fVar257)) &&
                      (0.0 <= fVar260)) && (fVar260 <= 1.0)) {
                    auVar53._12_4_ = 0;
                    auVar53._0_12_ = ZEXT812(0);
                    auVar78 = vrsqrt14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)local_6a0._0_4_));
                    fVar244 = auVar78._0_4_;
                    pGVar4 = (context->scene->geometries).items[local_718].ptr;
                    if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar64 = true;
                      }
                      else {
                        fVar244 = fVar244 * 1.5 +
                                  local_6a0._0_4_ * -0.5 * fVar244 * fVar244 * fVar244;
                        auVar180._0_4_ = local_680._0_4_ * fVar244;
                        auVar180._4_4_ = local_680._4_4_ * fVar244;
                        auVar180._8_4_ = local_680._8_4_ * fVar244;
                        auVar180._12_4_ = local_680._12_4_ * fVar244;
                        auVar84 = vfmadd213ps_fma(auVar77,auVar180,auVar16);
                        auVar78 = vshufps_avx(auVar180,auVar180,0xc9);
                        auVar77 = vshufps_avx(auVar16,auVar16,0xc9);
                        auVar181._0_4_ = auVar180._0_4_ * auVar77._0_4_;
                        auVar181._4_4_ = auVar180._4_4_ * auVar77._4_4_;
                        auVar181._8_4_ = auVar180._8_4_ * auVar77._8_4_;
                        auVar181._12_4_ = auVar180._12_4_ * auVar77._12_4_;
                        auVar16 = vfmsub231ps_fma(auVar181,auVar16,auVar78);
                        auVar78 = vshufps_avx(auVar16,auVar16,0xc9);
                        auVar77 = vshufps_avx(auVar84,auVar84,0xc9);
                        auVar16 = vshufps_avx(auVar16,auVar16,0xd2);
                        auVar147._0_4_ = auVar84._0_4_ * auVar16._0_4_;
                        auVar147._4_4_ = auVar84._4_4_ * auVar16._4_4_;
                        auVar147._8_4_ = auVar84._8_4_ * auVar16._8_4_;
                        auVar147._12_4_ = auVar84._12_4_ * auVar16._12_4_;
                        auVar78 = vfmsub231ps_fma(auVar147,auVar78,auVar77);
                        local_480 = (RTCHitN  [16])vshufps_avx(auVar78,auVar78,0x55);
                        auStack_470 = vshufps_avx(auVar78,auVar78,0xaa);
                        local_460 = auVar78._0_4_;
                        uStack_45c = local_460;
                        uStack_458 = local_460;
                        uStack_454 = local_460;
                        local_450 = fVar260;
                        fStack_44c = fVar260;
                        fStack_448 = fVar260;
                        fStack_444 = fVar260;
                        local_440 = ZEXT416(0) << 0x20;
                        local_430 = local_490._0_8_;
                        uStack_428 = local_490._8_8_;
                        local_420 = local_4a0;
                        vpcmpeqd_avx2(ZEXT1632(local_4a0),ZEXT1632(local_4a0));
                        uStack_40c = context->user->instID[0];
                        local_410 = uStack_40c;
                        uStack_408 = uStack_40c;
                        uStack_404 = uStack_40c;
                        uStack_400 = context->user->instPrimID[0];
                        uStack_3fc = uStack_400;
                        uStack_3f8 = uStack_400;
                        uStack_3f4 = uStack_400;
                        *(float *)(ray + k * 4 + 0x80) = fVar256;
                        local_950 = local_4b0._0_8_;
                        uStack_948 = local_4b0._8_8_;
                        local_710.valid = (int *)&local_950;
                        local_710.geometryUserPtr = pGVar4->userPtr;
                        local_710.context = context->user;
                        local_710.hit = local_480;
                        local_710.N = 4;
                        local_710.ray = (RTCRayN *)ray;
                        if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar236 = ZEXT464((uint)fVar258);
                          auVar253 = ZEXT1664(auVar252);
                          auVar255 = ZEXT1664(local_760);
                          auVar269 = ZEXT1664(local_680._0_16_);
                          (*pGVar4->occlusionFilterN)(&local_710);
                          auVar266 = ZEXT1664(ZEXT416((uint)fVar256));
                          auVar204 = ZEXT1664(ZEXT416((uint)fVar260));
                          auVar287 = ZEXT3264(local_880);
                          auVar286 = ZEXT3264(local_6e0);
                          auVar285 = ZEXT3264(local_860);
                          auVar284 = ZEXT3264(local_840);
                          auVar283 = ZEXT3264(local_820);
                          auVar282 = ZEXT3264(local_800);
                          auVar281 = ZEXT3264(local_920);
                          auVar280 = ZEXT3264(local_900);
                          auVar279 = ZEXT3264(local_7e0);
                          auVar278 = ZEXT3264(local_7c0);
                          auVar277 = ZEXT3264(local_7a0);
                          auVar276 = ZEXT3264(local_8e0);
                          auVar275 = ZEXT3264(local_8c0);
                          auVar274 = ZEXT3264(local_780);
                          auVar261 = ZEXT3264(_local_6c0);
                        }
                        auVar56._8_8_ = uStack_948;
                        auVar56._0_8_ = local_950;
                        uVar72 = vptestmd_avx512vl(auVar56,auVar56);
                        if ((uVar72 & 0xf) == 0) {
                          bVar64 = false;
                        }
                        else {
                          p_Var8 = context->args->filter;
                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar236 = ZEXT1664(auVar236._0_16_);
                            auVar253 = ZEXT1664(auVar253._0_16_);
                            auVar255 = ZEXT1664(auVar255._0_16_);
                            auVar269 = ZEXT1664(auVar269._0_16_);
                            (*p_Var8)(&local_710);
                            auVar266 = ZEXT1664(ZEXT416((uint)fVar256));
                            auVar204 = ZEXT1664(ZEXT416((uint)fVar260));
                            auVar287 = ZEXT3264(local_880);
                            auVar286 = ZEXT3264(local_6e0);
                            auVar285 = ZEXT3264(local_860);
                            auVar284 = ZEXT3264(local_840);
                            auVar283 = ZEXT3264(local_820);
                            auVar282 = ZEXT3264(local_800);
                            auVar281 = ZEXT3264(local_920);
                            auVar280 = ZEXT3264(local_900);
                            auVar279 = ZEXT3264(local_7e0);
                            auVar278 = ZEXT3264(local_7c0);
                            auVar277 = ZEXT3264(local_7a0);
                            auVar276 = ZEXT3264(local_8e0);
                            auVar275 = ZEXT3264(local_8c0);
                            auVar274 = ZEXT3264(local_780);
                            auVar261 = ZEXT3264(_local_6c0);
                          }
                          auVar57._8_8_ = uStack_948;
                          auVar57._0_8_ = local_950;
                          uVar72 = vptestmd_avx512vl(auVar57,auVar57);
                          uVar72 = uVar72 & 0xf;
                          auVar78 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar70 = (bool)((byte)uVar72 & 1);
                          auVar85._0_4_ =
                               (uint)bVar70 * auVar78._0_4_ |
                               (uint)!bVar70 * *(int *)(local_710.ray + 0x80);
                          bVar70 = (bool)((byte)(uVar72 >> 1) & 1);
                          auVar85._4_4_ =
                               (uint)bVar70 * auVar78._4_4_ |
                               (uint)!bVar70 * *(int *)(local_710.ray + 0x84);
                          bVar70 = (bool)((byte)(uVar72 >> 2) & 1);
                          auVar85._8_4_ =
                               (uint)bVar70 * auVar78._8_4_ |
                               (uint)!bVar70 * *(int *)(local_710.ray + 0x88);
                          bVar70 = SUB81(uVar72 >> 3,0);
                          auVar85._12_4_ =
                               (uint)bVar70 * auVar78._12_4_ |
                               (uint)!bVar70 * *(int *)(local_710.ray + 0x8c);
                          *(undefined1 (*) [16])(local_710.ray + 0x80) = auVar85;
                          bVar64 = (byte)uVar72 != 0;
                        }
                        if ((bool)bVar64 == false) {
                          *(float *)(ray + k * 4 + 0x80) = fVar257;
                        }
                      }
                      bVar70 = false;
                      goto LAB_01c37d0d;
                    }
                  }
                  bVar70 = false;
                  bVar64 = 0;
                }
              }
LAB_01c37d0d:
              if (!bVar70) goto LAB_01c380f1;
              lVar68 = lVar68 + -1;
            } while (lVar68 != 0);
            bVar64 = 0;
LAB_01c380f1:
            bVar65 = bVar65 | bVar64 & 1;
            auVar59._4_4_ = fStack_35c;
            auVar59._0_4_ = local_360;
            auVar59._8_4_ = fStack_358;
            auVar59._12_4_ = fStack_354;
            auVar59._16_4_ = fStack_350;
            auVar59._20_4_ = fStack_34c;
            auVar59._24_4_ = fStack_348;
            auVar59._28_4_ = fStack_344;
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar39._4_4_ = uVar2;
            auVar39._0_4_ = uVar2;
            auVar39._8_4_ = uVar2;
            auVar39._12_4_ = uVar2;
            auVar39._16_4_ = uVar2;
            auVar39._20_4_ = uVar2;
            auVar39._24_4_ = uVar2;
            auVar39._28_4_ = uVar2;
            uVar18 = vcmpps_avx512vl(auVar59,auVar39,2);
            bVar66 = bVar62 & bVar66 & (byte)uVar18;
          } while (bVar66 != 0);
        }
        uVar19 = vpcmpd_avx512vl(local_2e0,_local_380,1);
        uVar20 = vpcmpd_avx512vl(local_2e0,local_260,1);
        auVar182._0_4_ = auVar261._0_4_ + (float)local_1c0._0_4_;
        auVar182._4_4_ = auVar261._4_4_ + (float)local_1c0._4_4_;
        auVar182._8_4_ = auVar261._8_4_ + fStack_1b8;
        auVar182._12_4_ = auVar261._12_4_ + fStack_1b4;
        auVar182._16_4_ = auVar261._16_4_ + fStack_1b0;
        auVar182._20_4_ = auVar261._20_4_ + fStack_1ac;
        auVar182._24_4_ = auVar261._24_4_ + fStack_1a8;
        auVar182._28_4_ = auVar261._28_4_ + fStack_1a4;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar203._4_4_ = uVar2;
        auVar203._0_4_ = uVar2;
        auVar203._8_4_ = uVar2;
        auVar203._12_4_ = uVar2;
        auVar203._16_4_ = uVar2;
        auVar203._20_4_ = uVar2;
        auVar203._24_4_ = uVar2;
        auVar203._28_4_ = uVar2;
        uVar18 = vcmpps_avx512vl(auVar182,auVar203,2);
        bVar66 = (byte)local_930 & (byte)uVar20 & (byte)uVar18;
        auVar218._0_4_ = auVar261._0_4_ + (float)local_2a0._0_4_;
        auVar218._4_4_ = auVar261._4_4_ + (float)local_2a0._4_4_;
        auVar218._8_4_ = auVar261._8_4_ + fStack_298;
        auVar218._12_4_ = auVar261._12_4_ + fStack_294;
        auVar218._16_4_ = auVar261._16_4_ + fStack_290;
        auVar218._20_4_ = auVar261._20_4_ + fStack_28c;
        auVar218._24_4_ = auVar261._24_4_ + fStack_288;
        auVar218._28_4_ = auVar261._28_4_ + fStack_284;
        uVar18 = vcmpps_avx512vl(auVar218,auVar203,2);
        bVar61 = bVar61 & (byte)uVar19 & (byte)uVar18 | bVar66;
        if (bVar61 == 0) {
          auVar219 = ZEXT3264(_DAT_02020f20);
          auVar204 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
        }
        else {
          uVar72 = local_720 & 0xffffffff;
          abStack_180[uVar72 * 0x60] = bVar61;
          auVar128._0_4_ =
               (uint)(bVar66 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar66 & 1) * local_2a0._0_4_;
          bVar70 = (bool)(bVar66 >> 1 & 1);
          auVar128._4_4_ = (uint)bVar70 * local_1c0._4_4_ | (uint)!bVar70 * local_2a0._4_4_;
          bVar70 = (bool)(bVar66 >> 2 & 1);
          auVar128._8_4_ = (uint)bVar70 * (int)fStack_1b8 | (uint)!bVar70 * (int)fStack_298;
          bVar70 = (bool)(bVar66 >> 3 & 1);
          auVar128._12_4_ = (uint)bVar70 * (int)fStack_1b4 | (uint)!bVar70 * (int)fStack_294;
          bVar70 = (bool)(bVar66 >> 4 & 1);
          auVar128._16_4_ = (uint)bVar70 * (int)fStack_1b0 | (uint)!bVar70 * (int)fStack_290;
          bVar70 = (bool)(bVar66 >> 5 & 1);
          auVar128._20_4_ = (uint)bVar70 * (int)fStack_1ac | (uint)!bVar70 * (int)fStack_28c;
          bVar70 = (bool)(bVar66 >> 6 & 1);
          auVar128._24_4_ = (uint)bVar70 * (int)fStack_1a8 | (uint)!bVar70 * (int)fStack_288;
          auVar128._28_4_ =
               (uint)(bVar66 >> 7) * (int)fStack_1a4 | (uint)!(bool)(bVar66 >> 7) * (int)fStack_284;
          *(undefined1 (*) [32])(auStack_160 + uVar72 * 0x60) = auVar128;
          uVar18 = vmovlps_avx(local_5b0);
          *(undefined8 *)(afStack_140 + uVar72 * 0x18) = uVar18;
          auStack_138[uVar72 * 0x18] = (int)local_728 + 1;
          auVar219 = ZEXT3264(_DAT_02020f20);
          auVar204 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          local_720 = (ulong)((int)local_720 + 1);
        }
      }
    }
    do {
      if ((int)local_720 == 0) {
        if (bVar65 != 0) {
          return local_9f1;
        }
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar30._4_4_ = uVar2;
        auVar30._0_4_ = uVar2;
        auVar30._8_4_ = uVar2;
        auVar30._12_4_ = uVar2;
        uVar18 = vcmpps_avx512vl(local_2f0,auVar30,2);
        uVar73 = (uint)uVar18 & (uint)local_508 - 1 & (uint)local_508;
        local_508 = (ulong)uVar73;
        local_9f1 = uVar73 != 0;
        if (!local_9f1) {
          return local_9f1;
        }
        goto LAB_01c35964;
      }
      uVar63 = (ulong)((int)local_720 - 1);
      lVar68 = uVar63 * 0x60;
      auVar94 = *(undefined1 (*) [32])(auStack_160 + lVar68);
      auVar183._0_4_ = auVar261._0_4_ + auVar94._0_4_;
      auVar183._4_4_ = auVar261._4_4_ + auVar94._4_4_;
      auVar183._8_4_ = auVar261._8_4_ + auVar94._8_4_;
      auVar183._12_4_ = auVar261._12_4_ + auVar94._12_4_;
      auVar183._16_4_ = auVar261._16_4_ + auVar94._16_4_;
      auVar183._20_4_ = auVar261._20_4_ + auVar94._20_4_;
      auVar183._24_4_ = auVar261._24_4_ + auVar94._24_4_;
      auVar183._28_4_ = auVar261._28_4_ + auVar94._28_4_;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar40._4_4_ = uVar2;
      auVar40._0_4_ = uVar2;
      auVar40._8_4_ = uVar2;
      auVar40._12_4_ = uVar2;
      auVar40._16_4_ = uVar2;
      auVar40._20_4_ = uVar2;
      auVar40._24_4_ = uVar2;
      auVar40._28_4_ = uVar2;
      uVar18 = vcmpps_avx512vl(auVar183,auVar40,2);
      uVar73 = (uint)uVar18 & (uint)abStack_180[lVar68];
      bVar61 = (byte)uVar73;
      uVar72 = uVar63;
      if (uVar73 != 0) {
        auVar184._8_4_ = 0x7f800000;
        auVar184._0_8_ = 0x7f8000007f800000;
        auVar184._12_4_ = 0x7f800000;
        auVar184._16_4_ = 0x7f800000;
        auVar184._20_4_ = 0x7f800000;
        auVar184._24_4_ = 0x7f800000;
        auVar184._28_4_ = 0x7f800000;
        auVar86 = vblendmps_avx512vl(auVar184,auVar94);
        auVar129._0_4_ =
             (uint)(bVar61 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar61 & 1) * (int)auVar94._0_4_;
        bVar70 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar70 * auVar86._4_4_ | (uint)!bVar70 * (int)auVar94._4_4_;
        bVar70 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar70 * auVar86._8_4_ | (uint)!bVar70 * (int)auVar94._8_4_;
        bVar70 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar70 * auVar86._12_4_ | (uint)!bVar70 * (int)auVar94._12_4_;
        bVar70 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar129._16_4_ = (uint)bVar70 * auVar86._16_4_ | (uint)!bVar70 * (int)auVar94._16_4_;
        bVar70 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar129._20_4_ = (uint)bVar70 * auVar86._20_4_ | (uint)!bVar70 * (int)auVar94._20_4_;
        bVar70 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar129._24_4_ = (uint)bVar70 * auVar86._24_4_ | (uint)!bVar70 * (int)auVar94._24_4_;
        auVar129._28_4_ =
             (uVar73 >> 7) * auVar86._28_4_ | (uint)!SUB41(uVar73 >> 7,0) * (int)auVar94._28_4_;
        auVar94 = vshufps_avx(auVar129,auVar129,0xb1);
        auVar94 = vminps_avx(auVar129,auVar94);
        auVar86 = vshufpd_avx(auVar94,auVar94,5);
        auVar94 = vminps_avx(auVar94,auVar86);
        auVar86 = vpermpd_avx2(auVar94,0x4e);
        auVar94 = vminps_avx(auVar94,auVar86);
        uVar18 = vcmpps_avx512vl(auVar129,auVar94,0);
        bVar66 = (byte)uVar18 & bVar61;
        if (bVar66 != 0) {
          uVar73 = (uint)bVar66;
        }
        fVar254 = afStack_140[uVar63 * 0x18 + 1];
        uVar130 = 0;
        for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
          uVar130 = uVar130 + 1;
        }
        local_728 = (ulong)auStack_138[uVar63 * 0x18];
        bVar66 = ~('\x01' << ((byte)uVar130 & 0x1f)) & bVar61;
        abStack_180[lVar68] = bVar66;
        auVar204 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        if (bVar66 != 0) {
          uVar72 = local_720 & 0xffffffff;
        }
        fVar256 = afStack_140[uVar63 * 0x18];
        auVar185._4_4_ = fVar256;
        auVar185._0_4_ = fVar256;
        auVar185._8_4_ = fVar256;
        auVar185._12_4_ = fVar256;
        auVar185._16_4_ = fVar256;
        auVar185._20_4_ = fVar256;
        auVar185._24_4_ = fVar256;
        auVar185._28_4_ = fVar256;
        fVar254 = fVar254 - fVar256;
        auVar156._4_4_ = fVar254;
        auVar156._0_4_ = fVar254;
        auVar156._8_4_ = fVar254;
        auVar156._12_4_ = fVar254;
        auVar156._16_4_ = fVar254;
        auVar156._20_4_ = fVar254;
        auVar156._24_4_ = fVar254;
        auVar156._28_4_ = fVar254;
        auVar78 = vfmadd132ps_fma(auVar156,auVar185,auVar219._0_32_);
        _local_480 = ZEXT1632(auVar78);
        local_5b0._8_8_ = 0;
        local_5b0._0_8_ = *(ulong *)(local_480 + (ulong)uVar130 * 4);
      }
      local_720 = uVar72;
    } while (bVar61 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }